

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  int iVar6;
  undefined4 uVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  int iVar52;
  undefined1 auVar53 [32];
  byte bVar54;
  ulong uVar55;
  uint uVar56;
  uint uVar57;
  long lVar58;
  long lVar59;
  Geometry *pGVar60;
  long lVar61;
  long lVar62;
  uint uVar63;
  byte bVar64;
  ulong uVar65;
  ulong uVar66;
  float fVar67;
  float fVar129;
  float fVar131;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar68;
  undefined1 auVar88 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar135;
  float fVar136;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  vint4 bi_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined4 uVar150;
  undefined8 uVar151;
  vint4 bi_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  float fVar155;
  float fVar156;
  float fVar164;
  vint4 bi;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  vint4 ai;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  vint4 ai_1;
  undefined1 auVar191 [16];
  vint4 ai_2;
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  float fVar194;
  float fVar196;
  float fVar197;
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_600 [16];
  Primitive *local_5f0;
  ulong local_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  RTCFilterFunctionNArguments local_5a0;
  undefined1 local_570 [16];
  Geometry *local_558;
  size_t local_550;
  Precalculations *local_548;
  ulong local_540;
  long local_538;
  LinearSpace3fa *local_530;
  ulong local_528;
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [32];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar65 = (ulong)(byte)prim[1];
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xf + 6)));
  lVar61 = uVar65 * 0x25;
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x11 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1a + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1b + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1c + 6)));
  uVar150 = *(undefined4 *)(prim + lVar61 + 0x12);
  auVar209._4_4_ = uVar150;
  auVar209._0_4_ = uVar150;
  auVar209._8_4_ = uVar150;
  auVar209._12_4_ = uVar150;
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar69 = vsubps_avx512vl(auVar82,*(undefined1 (*) [16])(prim + lVar61 + 6));
  fVar156 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar88 = vpmovsxwd_avx(auVar82);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar18 = vpmovsxwd_avx(auVar85);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar19 = vpmovsxwd_avx(auVar84);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar137 = vpmovsxwd_avx(auVar83);
  auVar70 = vpbroadcastd_avx512vl();
  auVar82 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar82 = vinsertps_avx512f(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar69 = vmulps_avx512vl(auVar209,auVar69);
  auVar71 = vmulps_avx512vl(auVar209,auVar82);
  auVar72 = vcvtdq2ps_avx512vl(auVar17);
  auVar73 = vcvtdq2ps_avx512vl(auVar78);
  auVar74 = vcvtdq2ps_avx512vl(auVar74);
  auVar75 = vcvtdq2ps_avx512vl(auVar75);
  auVar76 = vcvtdq2ps_avx512vl(auVar76);
  auVar82 = vcvtdq2ps_avx(auVar77);
  auVar85 = vcvtdq2ps_avx(auVar79);
  auVar84 = vcvtdq2ps_avx(auVar80);
  auVar83 = vcvtdq2ps_avx(auVar81);
  uVar150 = auVar71._0_4_;
  auVar200._4_4_ = uVar150;
  auVar200._0_4_ = uVar150;
  auVar200._8_4_ = uVar150;
  auVar200._12_4_ = uVar150;
  auVar17 = vshufps_avx(auVar71,auVar71,0x55);
  auVar78 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar77 = vmulps_avx512vl(auVar78,auVar74);
  auVar152._0_4_ = auVar78._0_4_ * auVar82._0_4_;
  auVar152._4_4_ = auVar78._4_4_ * auVar82._4_4_;
  auVar152._8_4_ = auVar78._8_4_ * auVar82._8_4_;
  auVar152._12_4_ = auVar78._12_4_ * auVar82._12_4_;
  auVar71._0_4_ = auVar83._0_4_ * auVar78._0_4_;
  auVar71._4_4_ = auVar83._4_4_ * auVar78._4_4_;
  auVar71._8_4_ = auVar83._8_4_ * auVar78._8_4_;
  auVar71._12_4_ = auVar83._12_4_ * auVar78._12_4_;
  auVar78 = vfmadd231ps_avx512vl(auVar77,auVar17,auVar73);
  auVar77 = vfmadd231ps_avx512vl(auVar152,auVar17,auVar76);
  auVar17 = vfmadd231ps_fma(auVar71,auVar84,auVar17);
  auVar78 = vfmadd231ps_avx512vl(auVar78,auVar200,auVar72);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar200,auVar75);
  auVar17 = vfmadd231ps_fma(auVar17,auVar85,auVar200);
  auVar79 = vbroadcastss_avx512vl(auVar69);
  auVar80 = vshufps_avx512vl(auVar69,auVar69,0x55);
  auVar81 = vshufps_avx512vl(auVar69,auVar69,0xaa);
  auVar74 = vmulps_avx512vl(auVar81,auVar74);
  auVar82 = vmulps_avx512vl(auVar81,auVar82);
  auVar83 = vmulps_avx512vl(auVar81,auVar83);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar80,auVar73);
  auVar82 = vfmadd231ps_avx512vl(auVar82,auVar80,auVar76);
  auVar84 = vfmadd231ps_avx512vl(auVar83,auVar80,auVar84);
  auVar72 = vfmadd231ps_avx512vl(auVar74,auVar79,auVar72);
  auVar73 = vfmadd231ps_avx512vl(auVar82,auVar79,auVar75);
  auVar71 = vfmadd231ps_fma(auVar84,auVar79,auVar85);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar212 = ZEXT1664(auVar82);
  auVar85 = vandps_avx512vl(auVar78,auVar82);
  auVar205._8_4_ = 0x219392ef;
  auVar205._0_8_ = 0x219392ef219392ef;
  auVar205._12_4_ = 0x219392ef;
  uVar55 = vcmpps_avx512vl(auVar85,auVar205,1);
  bVar11 = (bool)((byte)uVar55 & 1);
  auVar69._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar78._0_4_;
  bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar78._4_4_;
  bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar78._8_4_;
  bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar78._12_4_;
  auVar85 = vandps_avx512vl(auVar77,auVar82);
  uVar55 = vcmpps_avx512vl(auVar85,auVar205,1);
  bVar11 = (bool)((byte)uVar55 & 1);
  auVar86._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._0_4_;
  bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._4_4_;
  bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._8_4_;
  bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar77._12_4_;
  auVar82 = vandps_avx512vl(auVar17,auVar82);
  uVar55 = vcmpps_avx512vl(auVar82,auVar205,1);
  bVar11 = (bool)((byte)uVar55 & 1);
  auVar87._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar17._0_4_;
  bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar17._4_4_;
  bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar17._8_4_;
  bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar17._12_4_;
  auVar85 = vrcp14ps_avx512vl(auVar69);
  auVar206._8_4_ = 0x3f800000;
  auVar206._0_8_ = 0x3f8000003f800000;
  auVar206._12_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar69,auVar85,auVar206);
  auVar83 = vfmadd132ps_fma(auVar82,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar86);
  auVar82 = vfnmadd213ps_fma(auVar86,auVar85,auVar206);
  auVar81 = vfmadd132ps_fma(auVar82,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar87);
  auVar82 = vfnmadd213ps_fma(auVar87,auVar85,auVar206);
  auVar69 = vfmadd132ps_fma(auVar82,auVar85,auVar85);
  auVar178._4_4_ = fVar156;
  auVar178._0_4_ = fVar156;
  auVar178._8_4_ = fVar156;
  auVar178._12_4_ = fVar156;
  auVar82 = vcvtdq2ps_avx(auVar88);
  auVar85 = vcvtdq2ps_avx(auVar18);
  auVar85 = vsubps_avx(auVar85,auVar82);
  auVar88 = vfmadd213ps_fma(auVar85,auVar178,auVar82);
  auVar82 = vcvtdq2ps_avx(auVar19);
  auVar85 = vcvtdq2ps_avx(auVar137);
  auVar85 = vsubps_avx(auVar85,auVar82);
  auVar18 = vfmadd213ps_fma(auVar85,auVar178,auVar82);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar82 = vpmovsxwd_avx(auVar17);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar65 * 0x16 + 6);
  auVar85 = vpmovsxwd_avx(auVar78);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar82);
  auVar17 = vfmadd213ps_fma(auVar85,auVar178,auVar82);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar65 * 0x14 + 6);
  auVar82 = vpmovsxwd_avx(auVar74);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar65 * 0x18 + 6);
  auVar85 = vpmovsxwd_avx(auVar75);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar84 = vsubps_avx(auVar85,auVar82);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar65 * 0x1d + 6);
  auVar85 = vpmovsxwd_avx(auVar76);
  auVar84 = vfmadd213ps_fma(auVar84,auVar178,auVar82);
  auVar82 = vcvtdq2ps_avx(auVar85);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar65 * 0x21 + 6);
  auVar85 = vpmovsxwd_avx(auVar77);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar82);
  auVar78 = vfmadd213ps_fma(auVar85,auVar178,auVar82);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar65 * 0x1f + 6);
  auVar82 = vpmovsxwd_avx(auVar79);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar65 * 0x23 + 6);
  auVar85 = vpmovsxwd_avx(auVar80);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,auVar82);
  auVar85 = vfmadd213ps_fma(auVar85,auVar178,auVar82);
  auVar82 = vsubps_avx(auVar88,auVar72);
  auVar179._0_4_ = auVar83._0_4_ * auVar82._0_4_;
  auVar179._4_4_ = auVar83._4_4_ * auVar82._4_4_;
  auVar179._8_4_ = auVar83._8_4_ * auVar82._8_4_;
  auVar179._12_4_ = auVar83._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar18,auVar72);
  auVar157._0_4_ = auVar83._0_4_ * auVar82._0_4_;
  auVar157._4_4_ = auVar83._4_4_ * auVar82._4_4_;
  auVar157._8_4_ = auVar83._8_4_ * auVar82._8_4_;
  auVar157._12_4_ = auVar83._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar17,auVar73);
  auVar191._0_4_ = auVar81._0_4_ * auVar82._0_4_;
  auVar191._4_4_ = auVar81._4_4_ * auVar82._4_4_;
  auVar191._8_4_ = auVar81._8_4_ * auVar82._8_4_;
  auVar191._12_4_ = auVar81._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar84,auVar73);
  auVar72._0_4_ = auVar81._0_4_ * auVar82._0_4_;
  auVar72._4_4_ = auVar81._4_4_ * auVar82._4_4_;
  auVar72._8_4_ = auVar81._8_4_ * auVar82._8_4_;
  auVar72._12_4_ = auVar81._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar78,auVar71);
  auVar73._0_4_ = auVar69._0_4_ * auVar82._0_4_;
  auVar73._4_4_ = auVar69._4_4_ * auVar82._4_4_;
  auVar73._8_4_ = auVar69._8_4_ * auVar82._8_4_;
  auVar73._12_4_ = auVar69._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar85,auVar71);
  auVar137._0_4_ = auVar69._0_4_ * auVar82._0_4_;
  auVar137._4_4_ = auVar69._4_4_ * auVar82._4_4_;
  auVar137._8_4_ = auVar69._8_4_ * auVar82._8_4_;
  auVar137._12_4_ = auVar69._12_4_ * auVar82._12_4_;
  auVar82 = vpminsd_avx(auVar179,auVar157);
  auVar85 = vpminsd_avx(auVar191,auVar72);
  auVar82 = vmaxps_avx(auVar82,auVar85);
  auVar85 = vpminsd_avx(auVar73,auVar137);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar81._4_4_ = uVar150;
  auVar81._0_4_ = uVar150;
  auVar81._8_4_ = uVar150;
  auVar81._12_4_ = uVar150;
  auVar85 = vmaxps_avx512vl(auVar85,auVar81);
  auVar82 = vmaxps_avx(auVar82,auVar85);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar82,auVar88);
  auVar82 = vpmaxsd_avx(auVar179,auVar157);
  auVar85 = vpmaxsd_avx(auVar191,auVar72);
  auVar82 = vminps_avx(auVar82,auVar85);
  auVar85 = vpmaxsd_avx(auVar73,auVar137);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar18._4_4_ = uVar150;
  auVar18._0_4_ = uVar150;
  auVar18._8_4_ = uVar150;
  auVar18._12_4_ = uVar150;
  auVar85 = vminps_avx512vl(auVar85,auVar18);
  auVar82 = vminps_avx(auVar82,auVar85);
  auVar19._8_4_ = 0x3f800003;
  auVar19._0_8_ = 0x3f8000033f800003;
  auVar19._12_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar19);
  uVar151 = vcmpps_avx512vl(local_190,auVar82,2);
  uVar20 = vpcmpgtd_avx512vl(auVar70,_DAT_01f4ad30);
  local_528 = (ulong)((byte)uVar151 & 0xf & (byte)uVar20);
  local_530 = pre->ray_space + k;
  local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar213 = ZEXT464(0xbf800000);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar214 = ZEXT1664(auVar82);
  local_5f0 = prim;
  local_550 = k;
  local_548 = pre;
  do {
    auVar99 = local_520;
    if (local_528 == 0) {
      return;
    }
    lVar61 = 0;
    for (uVar55 = local_528; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
      lVar61 = lVar61 + 1;
    }
    uVar63 = *(uint *)(prim + 2);
    local_5e8 = (ulong)uVar63;
    uVar57 = *(uint *)(prim + lVar61 * 4 + 6);
    local_540 = (ulong)uVar57;
    pGVar60 = (context->scene->geometries).items[local_5e8].ptr;
    uVar55 = (ulong)*(uint *)(*(long *)&pGVar60->field_0x58 +
                             local_540 *
                             pGVar60[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar156 = (pGVar60->time_range).lower;
    fVar156 = pGVar60->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar156) / ((pGVar60->time_range).upper - fVar156))
    ;
    auVar82 = vroundss_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),9);
    auVar85 = vaddss_avx512f(ZEXT416((uint)pGVar60->fnumTimeSegments),auVar213._0_16_);
    auVar82 = vminss_avx(auVar82,auVar85);
    auVar82 = vmaxss_avx(ZEXT816(0) << 0x20,auVar82);
    fVar156 = fVar156 - auVar82._0_4_;
    fVar194 = 1.0 - fVar156;
    _Var8 = pGVar60[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar58 = (long)(int)auVar82._0_4_ * 0x38;
    lVar62 = *(long *)(_Var8 + 0x10 + lVar58);
    lVar59 = *(long *)(_Var8 + 0x38 + lVar58);
    lVar9 = *(long *)(_Var8 + 0x48 + lVar58);
    auVar70._4_4_ = fVar156;
    auVar70._0_4_ = fVar156;
    auVar70._8_4_ = fVar156;
    auVar70._12_4_ = fVar156;
    pfVar3 = (float *)(lVar59 + lVar9 * uVar55);
    auVar202._0_4_ = fVar156 * *pfVar3;
    auVar202._4_4_ = fVar156 * pfVar3[1];
    auVar202._8_4_ = fVar156 * pfVar3[2];
    auVar202._12_4_ = fVar156 * pfVar3[3];
    lVar61 = uVar55 + 1;
    auVar82 = vmulps_avx512vl(auVar70,*(undefined1 (*) [16])(lVar59 + lVar9 * lVar61));
    p_Var10 = pGVar60[4].occlusionFilterN;
    auVar153._4_4_ = fVar194;
    auVar153._0_4_ = fVar194;
    auVar153._8_4_ = fVar194;
    auVar153._12_4_ = fVar194;
    local_5b0 = vfmadd231ps_fma(auVar202,auVar153,
                                *(undefined1 (*) [16])(*(long *)(_Var8 + lVar58) + lVar62 * uVar55))
    ;
    _local_5c0 = vfmadd231ps_avx512vl
                           (auVar82,auVar153,
                            *(undefined1 (*) [16])(*(long *)(_Var8 + lVar58) + lVar62 * lVar61));
    pfVar3 = (float *)(*(long *)(p_Var10 + lVar58 + 0x38) +
                      uVar55 * *(long *)(p_Var10 + lVar58 + 0x48));
    auVar207._0_4_ = fVar156 * *pfVar3;
    auVar207._4_4_ = fVar156 * pfVar3[1];
    auVar207._8_4_ = fVar156 * pfVar3[2];
    auVar207._12_4_ = fVar156 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var10 + lVar58 + 0x38) +
                      *(long *)(p_Var10 + lVar58 + 0x48) * lVar61);
    auVar208._0_4_ = fVar156 * *pfVar3;
    auVar208._4_4_ = fVar156 * pfVar3[1];
    auVar208._8_4_ = fVar156 * pfVar3[2];
    auVar208._12_4_ = fVar156 * pfVar3[3];
    auVar85 = vfmadd231ps_fma(auVar207,auVar153,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var10 + lVar58) +
                               *(long *)(p_Var10 + lVar58 + 0x10) * uVar55));
    auVar84 = vfmadd231ps_fma(auVar208,auVar153,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var10 + lVar58) +
                               *(long *)(p_Var10 + lVar58 + 0x10) * lVar61));
    auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    iVar6 = (int)pGVar60[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar82 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    local_5d0 = vfnmadd213ps_avx512vl(auVar85,auVar214._0_16_,local_5b0);
    local_5e0 = vfmadd213ps_avx512vl(auVar84,auVar214._0_16_,_local_5c0);
    auVar84 = vsubps_avx(local_5b0,auVar82);
    uVar150 = auVar84._0_4_;
    auVar166._4_4_ = uVar150;
    auVar166._0_4_ = uVar150;
    auVar166._8_4_ = uVar150;
    auVar166._12_4_ = uVar150;
    auVar85 = vshufps_avx(auVar84,auVar84,0x55);
    aVar4 = (local_530->vx).field_0;
    aVar5 = (local_530->vy).field_0;
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    fVar156 = (local_530->vz).field_0.m128[0];
    fVar194 = *(float *)((long)&(local_530->vz).field_0 + 4);
    fVar196 = *(float *)((long)&(local_530->vz).field_0 + 8);
    fVar197 = *(float *)((long)&(local_530->vz).field_0 + 0xc);
    auVar195._0_4_ = fVar156 * auVar84._0_4_;
    auVar195._4_4_ = fVar194 * auVar84._4_4_;
    auVar195._8_4_ = fVar196 * auVar84._8_4_;
    auVar195._12_4_ = fVar197 * auVar84._12_4_;
    auVar85 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar5,auVar85);
    auVar83 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar166);
    auVar84 = vsubps_avx(local_5d0,auVar82);
    uVar150 = auVar84._0_4_;
    auVar167._4_4_ = uVar150;
    auVar167._0_4_ = uVar150;
    auVar167._8_4_ = uVar150;
    auVar167._12_4_ = uVar150;
    auVar85 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar198._0_4_ = fVar156 * auVar84._0_4_;
    auVar198._4_4_ = fVar194 * auVar84._4_4_;
    auVar198._8_4_ = fVar196 * auVar84._8_4_;
    auVar198._12_4_ = fVar197 * auVar84._12_4_;
    auVar85 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar5,auVar85);
    auVar17 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar167);
    auVar84 = vsubps_avx(local_5e0,auVar82);
    uVar150 = auVar84._0_4_;
    auVar168._4_4_ = uVar150;
    auVar168._0_4_ = uVar150;
    auVar168._8_4_ = uVar150;
    auVar168._12_4_ = uVar150;
    auVar85 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar201._0_4_ = fVar156 * auVar84._0_4_;
    auVar201._4_4_ = fVar194 * auVar84._4_4_;
    auVar201._8_4_ = fVar196 * auVar84._8_4_;
    auVar201._12_4_ = fVar197 * auVar84._12_4_;
    auVar85 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar5,auVar85);
    auVar84 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar168);
    auVar85 = vsubps_avx512vl(_local_5c0,auVar82);
    uVar150 = auVar85._0_4_;
    auVar169._4_4_ = uVar150;
    auVar169._0_4_ = uVar150;
    auVar169._8_4_ = uVar150;
    auVar169._12_4_ = uVar150;
    auVar82 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar204._0_4_ = fVar156 * auVar85._0_4_;
    auVar204._4_4_ = fVar194 * auVar85._4_4_;
    auVar204._8_4_ = fVar196 * auVar85._8_4_;
    auVar204._12_4_ = fVar197 * auVar85._12_4_;
    auVar82 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar5,auVar82);
    lVar61 = (long)iVar6;
    lVar62 = lVar61 * 0x44;
    auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar62);
    auVar78 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar4,auVar169);
    uVar150 = auVar83._0_4_;
    local_2e0._4_4_ = uVar150;
    local_2e0._0_4_ = uVar150;
    local_2e0._8_4_ = uVar150;
    local_2e0._12_4_ = uVar150;
    local_2e0._16_4_ = uVar150;
    local_2e0._20_4_ = uVar150;
    local_2e0._24_4_ = uVar150;
    local_2e0._28_4_ = uVar150;
    auVar89._8_4_ = 1;
    auVar89._0_8_ = 0x100000001;
    auVar89._12_4_ = 1;
    auVar89._16_4_ = 1;
    auVar89._20_4_ = 1;
    auVar89._24_4_ = 1;
    auVar89._28_4_ = 1;
    local_300 = vpermps_avx2(auVar89,ZEXT1632(auVar83));
    auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 + 0x484);
    uVar150 = auVar17._0_4_;
    auVar170._4_4_ = uVar150;
    auVar170._0_4_ = uVar150;
    auVar170._8_4_ = uVar150;
    auVar170._12_4_ = uVar150;
    local_320._16_4_ = uVar150;
    local_320._0_16_ = auVar170;
    local_320._20_4_ = uVar150;
    local_320._24_4_ = uVar150;
    local_320._28_4_ = uVar150;
    local_340 = vpermps_avx512vl(auVar89,ZEXT1632(auVar17));
    auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 + 0x908);
    local_360 = vbroadcastss_avx512vl(auVar84);
    auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 + 0xd8c);
    local_380 = vpermps_avx512vl(auVar89,ZEXT1632(auVar84));
    uVar150 = auVar78._0_4_;
    local_3a0._4_4_ = uVar150;
    local_3a0._0_4_ = uVar150;
    fStack_398 = (float)uVar150;
    fStack_394 = (float)uVar150;
    fStack_390 = (float)uVar150;
    fStack_38c = (float)uVar150;
    fStack_388 = (float)uVar150;
    register0x0000139c = uVar150;
    _local_3c0 = vpermps_avx512vl(auVar89,ZEXT1632(auVar78));
    auVar89 = vmulps_avx512vl(_local_3a0,auVar102);
    auVar90 = vmulps_avx512vl(_local_3c0,auVar102);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar103,local_360);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_380);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar105,local_320);
    auVar91 = vfmadd231ps_avx512vl(auVar90,auVar105,local_340);
    auVar92 = vfmadd231ps_avx512vl(auVar89,auVar101,local_2e0);
    auVar189 = ZEXT3264(auVar92);
    auVar89 = *(undefined1 (*) [32])(bezier_basis1 + lVar62);
    auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 + 0x484);
    auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 + 0x908);
    auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 + 0xd8c);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar101,local_300);
    auVar184 = ZEXT3264(auVar91);
    auVar93 = vmulps_avx512vl(_local_3a0,auVar100);
    auVar94 = vmulps_avx512vl(_local_3c0,auVar100);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,local_360);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar104,local_380);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar90,local_320);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_340);
    auVar74 = vfmadd231ps_fma(auVar93,auVar89,local_2e0);
    auVar192 = ZEXT1664(auVar74);
    auVar75 = vfmadd231ps_fma(auVar94,auVar89,local_300);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar74),auVar92);
    auVar94 = vsubps_avx512vl(ZEXT1632(auVar75),auVar91);
    auVar95 = vmulps_avx512vl(auVar91,auVar93);
    auVar96 = vmulps_avx512vl(auVar92,auVar94);
    auVar95 = vsubps_avx512vl(auVar95,auVar96);
    auVar82 = vshufps_avx(local_5b0,local_5b0,0xff);
    uVar151 = auVar82._0_8_;
    local_80._8_8_ = uVar151;
    local_80._0_8_ = uVar151;
    local_80._16_8_ = uVar151;
    local_80._24_8_ = uVar151;
    auVar82 = vshufps_avx(local_5d0,local_5d0,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar82);
    auVar82 = vshufps_avx(local_5e0,local_5e0,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar82);
    auVar82 = vshufps_avx512vl(_local_5c0,_local_5c0,0xff);
    uVar151 = auVar82._0_8_;
    local_e0._8_8_ = uVar151;
    local_e0._0_8_ = uVar151;
    local_e0._16_8_ = uVar151;
    local_e0._24_8_ = uVar151;
    auVar96 = vmulps_avx512vl(local_e0,auVar102);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,local_c0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_a0);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar101,local_80);
    auVar97 = vmulps_avx512vl(local_e0,auVar100);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar104,local_c0);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,local_a0);
    auVar76 = vfmadd231ps_fma(auVar97,auVar89,local_80);
    auVar97 = vmulps_avx512vl(auVar94,auVar94);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar93);
    auVar98 = vmaxps_avx512vl(auVar96,ZEXT1632(auVar76));
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar97 = vmulps_avx512vl(auVar98,auVar97);
    auVar95 = vmulps_avx512vl(auVar95,auVar95);
    uVar151 = vcmpps_avx512vl(auVar95,auVar97,2);
    auVar82 = vblendps_avx(auVar83,local_5b0,8);
    auVar79 = auVar212._0_16_;
    auVar85 = vandps_avx512vl(auVar82,auVar79);
    auVar82 = vblendps_avx(auVar17,local_5d0,8);
    auVar82 = vandps_avx512vl(auVar82,auVar79);
    auVar85 = vmaxps_avx(auVar85,auVar82);
    auVar82 = vblendps_avx(auVar84,local_5e0,8);
    auVar77 = vandps_avx512vl(auVar82,auVar79);
    auVar82 = vblendps_avx(auVar78,_local_5c0,8);
    auVar82 = vandps_avx512vl(auVar82,auVar79);
    auVar82 = vmaxps_avx(auVar77,auVar82);
    auVar82 = vmaxps_avx(auVar85,auVar82);
    auVar85 = vmovshdup_avx(auVar82);
    auVar85 = vmaxss_avx(auVar85,auVar82);
    auVar82 = vshufpd_avx(auVar82,auVar82,1);
    auVar82 = vmaxss_avx(auVar82,auVar85);
    auVar95._0_4_ = (float)iVar6;
    local_520._4_12_ = local_5e0._4_12_;
    local_520._0_4_ = auVar95._0_4_;
    local_520._16_16_ = auVar99._16_16_;
    auVar95._4_4_ = auVar95._0_4_;
    auVar95._8_4_ = auVar95._0_4_;
    auVar95._12_4_ = auVar95._0_4_;
    auVar95._16_4_ = auVar95._0_4_;
    auVar95._20_4_ = auVar95._0_4_;
    auVar95._24_4_ = auVar95._0_4_;
    auVar95._28_4_ = auVar95._0_4_;
    uVar20 = vcmpps_avx512vl(auVar95,_DAT_01f7b060,0xe);
    bVar64 = (byte)uVar151 & (byte)uVar20;
    fVar156 = auVar82._0_4_ * 4.7683716e-07;
    local_570 = ZEXT416((uint)fVar156);
    auVar99._8_4_ = 2;
    auVar99._0_8_ = 0x200000002;
    auVar99._12_4_ = 2;
    auVar99._16_4_ = 2;
    auVar99._20_4_ = 2;
    auVar99._24_4_ = 2;
    auVar99._28_4_ = 2;
    local_120 = vpermps_avx2(auVar99,ZEXT1632(auVar83));
    local_140 = vpermps_avx2(auVar99,ZEXT1632(auVar17));
    local_160 = vpermps_avx2(auVar99,ZEXT1632(auVar84));
    local_180 = vpermps_avx2(auVar99,ZEXT1632(auVar78));
    local_480 = *(undefined4 *)(ray + k * 4 + 0x30);
    uStack_47c = 0;
    uStack_478 = 0;
    uStack_474 = 0;
    local_4d0 = vpbroadcastd_avx512vl();
    local_4e0 = vpbroadcastd_avx512vl();
    if (bVar64 != 0) {
      auVar99 = vmulps_avx512vl(local_180,auVar100);
      auVar99 = vfmadd213ps_avx512vl(auVar104,local_160,auVar99);
      auVar99 = vfmadd213ps_avx512vl(auVar90,local_140,auVar99);
      auVar89 = vfmadd213ps_avx512vl(auVar89,local_120,auVar99);
      auVar99 = vmulps_avx512vl(local_180,auVar102);
      auVar99 = vfmadd213ps_avx512vl(auVar103,local_160,auVar99);
      auVar90 = vfmadd213ps_avx512vl(auVar105,local_140,auVar99);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 + 0x1210);
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 + 0x1b18);
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar62 + 0x1f9c);
      auVar100 = vfmadd213ps_avx512vl(auVar101,local_120,auVar90);
      auVar101 = vmulps_avx512vl(_local_3a0,auVar102);
      auVar90 = vmulps_avx512vl(_local_3c0,auVar102);
      auVar102 = vmulps_avx512vl(local_180,auVar102);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar103,local_360);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,local_380);
      auVar103 = vfmadd231ps_avx512vl(auVar102,local_160,auVar103);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,local_320);
      auVar102 = vfmadd231ps_avx512vl(auVar90,auVar105,local_340);
      auVar90 = vfmadd231ps_avx512vl(auVar103,local_140,auVar105);
      auVar82 = vfmadd231ps_fma(auVar101,auVar99,local_2e0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar99,local_300);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 + 0x1210);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 + 0x1b18);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 + 0x1f9c);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_120,auVar99);
      auVar99 = vmulps_avx512vl(_local_3a0,auVar103);
      auVar104 = vmulps_avx512vl(_local_3c0,auVar103);
      auVar103 = vmulps_avx512vl(local_180,auVar103);
      auVar97 = vfmadd231ps_avx512vl(auVar99,auVar105,local_360);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar105,local_380);
      auVar105 = vfmadd231ps_avx512vl(auVar103,local_160,auVar105);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar62 + 0x1694);
      auVar103 = vfmadd231ps_avx512vl(auVar97,auVar99,local_320);
      auVar104 = vfmadd231ps_avx512vl(auVar104,auVar99,local_340);
      auVar99 = vfmadd231ps_avx512vl(auVar105,local_140,auVar99);
      auVar85 = vfmadd231ps_fma(auVar103,auVar101,local_2e0);
      auVar105 = vfmadd231ps_avx512vl(auVar104,auVar101,local_300);
      auVar103 = vfmadd231ps_avx512vl(auVar99,local_120,auVar101);
      auVar213 = ZEXT1664(auVar213._0_16_);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
      auVar214 = ZEXT1664(auVar84);
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar212 = ZEXT1664(auVar84);
      auVar210._8_4_ = 0x7fffffff;
      auVar210._0_8_ = 0x7fffffff7fffffff;
      auVar210._12_4_ = 0x7fffffff;
      auVar210._16_4_ = 0x7fffffff;
      auVar210._20_4_ = 0x7fffffff;
      auVar210._24_4_ = 0x7fffffff;
      auVar210._28_4_ = 0x7fffffff;
      auVar99 = vandps_avx(ZEXT1632(auVar82),auVar210);
      auVar101 = vandps_avx(auVar102,auVar210);
      auVar101 = vmaxps_avx(auVar99,auVar101);
      auVar99 = vandps_avx(auVar90,auVar210);
      auVar99 = vmaxps_avx(auVar101,auVar99);
      auVar203._4_4_ = fVar156;
      auVar203._0_4_ = fVar156;
      auVar203._8_4_ = fVar156;
      auVar203._12_4_ = fVar156;
      auVar203._16_4_ = fVar156;
      auVar203._20_4_ = fVar156;
      auVar203._24_4_ = fVar156;
      auVar203._28_4_ = fVar156;
      uVar55 = vcmpps_avx512vl(auVar99,auVar203,1);
      bVar11 = (bool)((byte)uVar55 & 1);
      auVar97._0_4_ = (float)((uint)bVar11 * auVar93._0_4_ | (uint)!bVar11 * auVar82._0_4_);
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar97._4_4_ = (float)((uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar82._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar97._8_4_ = (float)((uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar82._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar97._12_4_ = (float)((uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar82._12_4_);
      fVar196 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar93._16_4_);
      auVar97._16_4_ = fVar196;
      fVar194 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar93._20_4_);
      auVar97._20_4_ = fVar194;
      fVar197 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar93._24_4_);
      auVar97._24_4_ = fVar197;
      uVar56 = (uint)(byte)(uVar55 >> 7) * auVar93._28_4_;
      auVar97._28_4_ = uVar56;
      bVar11 = (bool)((byte)uVar55 & 1);
      auVar98._0_4_ = (float)((uint)bVar11 * auVar94._0_4_ | (uint)!bVar11 * auVar102._0_4_);
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar98._4_4_ = (float)((uint)bVar11 * auVar94._4_4_ | (uint)!bVar11 * auVar102._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar98._8_4_ = (float)((uint)bVar11 * auVar94._8_4_ | (uint)!bVar11 * auVar102._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar98._12_4_ = (float)((uint)bVar11 * auVar94._12_4_ | (uint)!bVar11 * auVar102._12_4_);
      bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar98._16_4_ = (float)((uint)bVar11 * auVar94._16_4_ | (uint)!bVar11 * auVar102._16_4_);
      bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar98._20_4_ = (float)((uint)bVar11 * auVar94._20_4_ | (uint)!bVar11 * auVar102._20_4_);
      bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar98._24_4_ = (float)((uint)bVar11 * auVar94._24_4_ | (uint)!bVar11 * auVar102._24_4_);
      bVar11 = SUB81(uVar55 >> 7,0);
      auVar98._28_4_ = (uint)bVar11 * auVar94._28_4_ | (uint)!bVar11 * auVar102._28_4_;
      auVar99 = vandps_avx(auVar210,ZEXT1632(auVar85));
      auVar101 = vandps_avx(auVar105,auVar210);
      auVar101 = vmaxps_avx(auVar99,auVar101);
      auVar99 = vandps_avx(auVar103,auVar210);
      auVar99 = vmaxps_avx(auVar101,auVar99);
      uVar55 = vcmpps_avx512vl(auVar99,auVar203,1);
      bVar11 = (bool)((byte)uVar55 & 1);
      auVar106._0_4_ = (float)((uint)bVar11 * auVar93._0_4_ | (uint)!bVar11 * auVar85._0_4_);
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar11 * auVar93._4_4_ | (uint)!bVar11 * auVar85._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar11 * auVar93._8_4_ | (uint)!bVar11 * auVar85._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar11 * auVar93._12_4_ | (uint)!bVar11 * auVar85._12_4_);
      fVar165 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar93._16_4_);
      auVar106._16_4_ = fVar165;
      fVar155 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar93._20_4_);
      auVar106._20_4_ = fVar155;
      fVar164 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar93._24_4_);
      auVar106._24_4_ = fVar164;
      auVar106._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar93._28_4_;
      bVar11 = (bool)((byte)uVar55 & 1);
      auVar107._0_4_ = (float)((uint)bVar11 * auVar94._0_4_ | (uint)!bVar11 * auVar105._0_4_);
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar11 * auVar94._4_4_ | (uint)!bVar11 * auVar105._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar11 * auVar94._8_4_ | (uint)!bVar11 * auVar105._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar11 * auVar94._12_4_ | (uint)!bVar11 * auVar105._12_4_);
      bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar107._16_4_ = (float)((uint)bVar11 * auVar94._16_4_ | (uint)!bVar11 * auVar105._16_4_);
      bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar107._20_4_ = (float)((uint)bVar11 * auVar94._20_4_ | (uint)!bVar11 * auVar105._20_4_);
      bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar107._24_4_ = (float)((uint)bVar11 * auVar94._24_4_ | (uint)!bVar11 * auVar105._24_4_);
      bVar11 = SUB81(uVar55 >> 7,0);
      auVar107._28_4_ = (uint)bVar11 * auVar94._28_4_ | (uint)!bVar11 * auVar105._28_4_;
      auVar81 = vxorps_avx512vl(auVar170,auVar170);
      auVar99 = vfmadd213ps_avx512vl(auVar97,auVar97,ZEXT1632(auVar81));
      auVar82 = vfmadd231ps_fma(auVar99,auVar98,auVar98);
      auVar99 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
      fVar67 = auVar99._0_4_;
      fVar68 = auVar99._4_4_;
      fVar129 = auVar99._8_4_;
      fVar130 = auVar99._12_4_;
      fVar131 = auVar99._16_4_;
      fVar132 = auVar99._20_4_;
      fVar133 = auVar99._24_4_;
      auVar101._4_4_ = fVar68 * fVar68 * fVar68 * auVar82._4_4_ * -0.5;
      auVar101._0_4_ = fVar67 * fVar67 * fVar67 * auVar82._0_4_ * -0.5;
      auVar101._8_4_ = fVar129 * fVar129 * fVar129 * auVar82._8_4_ * -0.5;
      auVar101._12_4_ = fVar130 * fVar130 * fVar130 * auVar82._12_4_ * -0.5;
      auVar101._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
      auVar101._20_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar101._24_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar101._28_4_ = 0;
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar90,auVar99);
      auVar105._4_4_ = auVar98._4_4_ * auVar101._4_4_;
      auVar105._0_4_ = auVar98._0_4_ * auVar101._0_4_;
      auVar105._8_4_ = auVar98._8_4_ * auVar101._8_4_;
      auVar105._12_4_ = auVar98._12_4_ * auVar101._12_4_;
      auVar105._16_4_ = auVar98._16_4_ * auVar101._16_4_;
      auVar105._20_4_ = auVar98._20_4_ * auVar101._20_4_;
      auVar105._24_4_ = auVar98._24_4_ * auVar101._24_4_;
      auVar105._28_4_ = auVar99._28_4_;
      auVar103._4_4_ = auVar101._4_4_ * -auVar97._4_4_;
      auVar103._0_4_ = auVar101._0_4_ * -auVar97._0_4_;
      auVar103._8_4_ = auVar101._8_4_ * -auVar97._8_4_;
      auVar103._12_4_ = auVar101._12_4_ * -auVar97._12_4_;
      auVar103._16_4_ = auVar101._16_4_ * -fVar196;
      auVar103._20_4_ = auVar101._20_4_ * -fVar194;
      auVar103._24_4_ = auVar101._24_4_ * -fVar197;
      auVar103._28_4_ = uVar56 ^ 0x80000000;
      auVar99 = vmulps_avx512vl(auVar101,ZEXT1632(auVar81));
      auVar94 = ZEXT1632(auVar81);
      auVar102 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar94);
      auVar82 = vfmadd231ps_fma(auVar102,auVar107,auVar107);
      auVar104 = vrsqrt14ps_avx512vl(ZEXT1632(auVar82));
      fVar194 = auVar104._0_4_;
      fVar196 = auVar104._4_4_;
      fVar197 = auVar104._8_4_;
      fVar67 = auVar104._12_4_;
      fVar68 = auVar104._16_4_;
      fVar129 = auVar104._20_4_;
      fVar130 = auVar104._24_4_;
      auVar102._4_4_ = fVar196 * fVar196 * fVar196 * auVar82._4_4_ * -0.5;
      auVar102._0_4_ = fVar194 * fVar194 * fVar194 * auVar82._0_4_ * -0.5;
      auVar102._8_4_ = fVar197 * fVar197 * fVar197 * auVar82._8_4_ * -0.5;
      auVar102._12_4_ = fVar67 * fVar67 * fVar67 * auVar82._12_4_ * -0.5;
      auVar102._16_4_ = fVar68 * fVar68 * fVar68 * -0.0;
      auVar102._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
      auVar102._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
      auVar102._28_4_ = 0;
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar104);
      auVar90._4_4_ = auVar107._4_4_ * auVar102._4_4_;
      auVar90._0_4_ = auVar107._0_4_ * auVar102._0_4_;
      auVar90._8_4_ = auVar107._8_4_ * auVar102._8_4_;
      auVar90._12_4_ = auVar107._12_4_ * auVar102._12_4_;
      auVar90._16_4_ = auVar107._16_4_ * auVar102._16_4_;
      auVar90._20_4_ = auVar107._20_4_ * auVar102._20_4_;
      auVar90._24_4_ = auVar107._24_4_ * auVar102._24_4_;
      auVar90._28_4_ = auVar104._28_4_;
      auVar104._4_4_ = -auVar106._4_4_ * auVar102._4_4_;
      auVar104._0_4_ = -auVar106._0_4_ * auVar102._0_4_;
      auVar104._8_4_ = -auVar106._8_4_ * auVar102._8_4_;
      auVar104._12_4_ = -auVar106._12_4_ * auVar102._12_4_;
      auVar104._16_4_ = -fVar165 * auVar102._16_4_;
      auVar104._20_4_ = -fVar155 * auVar102._20_4_;
      auVar104._24_4_ = -fVar164 * auVar102._24_4_;
      auVar104._28_4_ = auVar101._28_4_;
      auVar101 = vmulps_avx512vl(auVar102,auVar94);
      auVar82 = vfmadd213ps_fma(auVar105,auVar96,auVar92);
      auVar85 = vfmadd213ps_fma(auVar103,auVar96,auVar91);
      auVar102 = vfmadd213ps_avx512vl(auVar99,auVar96,auVar100);
      auVar93 = vfmadd213ps_avx512vl(auVar90,ZEXT1632(auVar76),ZEXT1632(auVar74));
      auVar77 = vfnmadd213ps_fma(auVar105,auVar96,auVar92);
      auVar92 = ZEXT1632(auVar76);
      auVar84 = vfmadd213ps_fma(auVar104,auVar92,ZEXT1632(auVar75));
      auVar79 = vfnmadd213ps_fma(auVar103,auVar96,auVar91);
      auVar83 = vfmadd213ps_fma(auVar101,auVar92,auVar89);
      auVar105 = vfnmadd231ps_avx512vl(auVar100,auVar96,auVar99);
      auVar74 = vfnmadd213ps_fma(auVar90,auVar92,ZEXT1632(auVar74));
      auVar75 = vfnmadd213ps_fma(auVar104,auVar92,ZEXT1632(auVar75));
      auVar80 = vfnmadd231ps_fma(auVar89,ZEXT1632(auVar76),auVar101);
      auVar101 = vsubps_avx512vl(auVar93,ZEXT1632(auVar77));
      auVar99 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar79));
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar83),auVar105);
      auVar89 = vmulps_avx512vl(auVar99,auVar105);
      auVar17 = vfmsub231ps_fma(auVar89,ZEXT1632(auVar79),auVar103);
      auVar100._4_4_ = auVar77._4_4_ * auVar103._4_4_;
      auVar100._0_4_ = auVar77._0_4_ * auVar103._0_4_;
      auVar100._8_4_ = auVar77._8_4_ * auVar103._8_4_;
      auVar100._12_4_ = auVar77._12_4_ * auVar103._12_4_;
      auVar100._16_4_ = auVar103._16_4_ * 0.0;
      auVar100._20_4_ = auVar103._20_4_ * 0.0;
      auVar100._24_4_ = auVar103._24_4_ * 0.0;
      auVar100._28_4_ = auVar103._28_4_;
      auVar103 = vfmsub231ps_avx512vl(auVar100,auVar105,auVar101);
      auVar91._4_4_ = auVar79._4_4_ * auVar101._4_4_;
      auVar91._0_4_ = auVar79._0_4_ * auVar101._0_4_;
      auVar91._8_4_ = auVar79._8_4_ * auVar101._8_4_;
      auVar91._12_4_ = auVar79._12_4_ * auVar101._12_4_;
      auVar91._16_4_ = auVar101._16_4_ * 0.0;
      auVar91._20_4_ = auVar101._20_4_ * 0.0;
      auVar91._24_4_ = auVar101._24_4_ * 0.0;
      auVar91._28_4_ = auVar101._28_4_;
      auVar78 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar77),auVar99);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar94,auVar103);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar94,ZEXT1632(auVar17));
      auVar97 = ZEXT1632(auVar81);
      uVar55 = vcmpps_avx512vl(auVar99,auVar97,2);
      bVar54 = (byte)uVar55;
      fVar67 = (float)((uint)(bVar54 & 1) * auVar82._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar74._0_4_);
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      fVar129 = (float)((uint)bVar11 * auVar82._4_4_ | (uint)!bVar11 * auVar74._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      fVar131 = (float)((uint)bVar11 * auVar82._8_4_ | (uint)!bVar11 * auVar74._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      fVar133 = (float)((uint)bVar11 * auVar82._12_4_ | (uint)!bVar11 * auVar74._12_4_);
      auVar90 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar131,CONCAT44(fVar129,fVar67))));
      fVar68 = (float)((uint)(bVar54 & 1) * auVar85._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar75._0_4_);
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      fVar130 = (float)((uint)bVar11 * auVar85._4_4_ | (uint)!bVar11 * auVar75._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      fVar132 = (float)((uint)bVar11 * auVar85._8_4_ | (uint)!bVar11 * auVar75._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      fVar134 = (float)((uint)bVar11 * auVar85._12_4_ | (uint)!bVar11 * auVar75._12_4_);
      auVar104 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar132,CONCAT44(fVar130,fVar68))));
      auVar108._0_4_ =
           (float)((uint)(bVar54 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar80._0_4_);
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * auVar80._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * auVar80._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * auVar80._12_4_);
      fVar194 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar102._16_4_);
      auVar108._16_4_ = fVar194;
      fVar196 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar102._20_4_);
      auVar108._20_4_ = fVar196;
      fVar197 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar102._24_4_);
      auVar108._24_4_ = fVar197;
      iVar1 = (uint)(byte)(uVar55 >> 7) * auVar102._28_4_;
      auVar108._28_4_ = iVar1;
      auVar101 = vblendmps_avx512vl(ZEXT1632(auVar77),auVar93);
      auVar109._0_4_ =
           (uint)(bVar54 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar85._0_4_;
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar109._4_4_ = (uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar85._4_4_;
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar109._8_4_ = (uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar85._8_4_;
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar109._12_4_ = (uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar85._12_4_;
      auVar109._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * auVar101._16_4_;
      auVar109._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * auVar101._20_4_;
      auVar109._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * auVar101._24_4_;
      auVar109._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar101._28_4_;
      auVar101 = vblendmps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar84));
      auVar110._0_4_ =
           (float)((uint)(bVar54 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar17._0_4_);
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar17._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar17._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar17._12_4_);
      fVar165 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar101._16_4_);
      auVar110._16_4_ = fVar165;
      fVar155 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar101._20_4_);
      auVar110._20_4_ = fVar155;
      fVar164 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar101._24_4_);
      auVar110._24_4_ = fVar164;
      auVar110._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar101._28_4_;
      auVar101 = vblendmps_avx512vl(auVar105,ZEXT1632(auVar83));
      auVar111._0_4_ =
           (float)((uint)(bVar54 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar102._0_4_)
      ;
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar102._4_4_);
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar102._8_4_);
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar102._12_4_);
      bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
      auVar111._16_4_ = (float)((uint)bVar11 * auVar101._16_4_ | (uint)!bVar11 * auVar102._16_4_);
      bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
      auVar111._20_4_ = (float)((uint)bVar11 * auVar101._20_4_ | (uint)!bVar11 * auVar102._20_4_);
      bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
      auVar111._24_4_ = (float)((uint)bVar11 * auVar101._24_4_ | (uint)!bVar11 * auVar102._24_4_);
      bVar11 = SUB81(uVar55 >> 7,0);
      auVar111._28_4_ = (uint)bVar11 * auVar101._28_4_ | (uint)!bVar11 * auVar102._28_4_;
      auVar112._0_4_ =
           (uint)(bVar54 & 1) * (int)auVar77._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar93._0_4_;
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar11 * (int)auVar77._4_4_ | (uint)!bVar11 * auVar93._4_4_;
      bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar11 * (int)auVar77._8_4_ | (uint)!bVar11 * auVar93._8_4_;
      bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar11 * (int)auVar77._12_4_ | (uint)!bVar11 * auVar93._12_4_;
      auVar112._16_4_ = (uint)!(bool)((byte)(uVar55 >> 4) & 1) * auVar93._16_4_;
      auVar112._20_4_ = (uint)!(bool)((byte)(uVar55 >> 5) & 1) * auVar93._20_4_;
      auVar112._24_4_ = (uint)!(bool)((byte)(uVar55 >> 6) & 1) * auVar93._24_4_;
      auVar112._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar93._28_4_;
      bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar113._0_4_ =
           (uint)(bVar54 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar83._0_4_;
      bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar12 * auVar105._4_4_ | (uint)!bVar12 * auVar83._4_4_;
      bVar12 = (bool)((byte)(uVar55 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar12 * auVar105._8_4_ | (uint)!bVar12 * auVar83._8_4_;
      bVar12 = (bool)((byte)(uVar55 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar12 * auVar105._12_4_ | (uint)!bVar12 * auVar83._12_4_;
      auVar113._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * auVar105._16_4_;
      auVar113._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * auVar105._20_4_;
      auVar113._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * auVar105._24_4_;
      iVar2 = (uint)(byte)(uVar55 >> 7) * auVar105._28_4_;
      auVar113._28_4_ = iVar2;
      auVar100 = vsubps_avx512vl(auVar112,auVar90);
      auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar79._12_4_ |
                                               (uint)!bVar14 * auVar84._12_4_,
                                               CONCAT48((uint)bVar13 * (int)auVar79._8_4_ |
                                                        (uint)!bVar13 * auVar84._8_4_,
                                                        CONCAT44((uint)bVar11 * (int)auVar79._4_4_ |
                                                                 (uint)!bVar11 * auVar84._4_4_,
                                                                 (uint)(bVar54 & 1) *
                                                                 (int)auVar79._0_4_ |
                                                                 (uint)!(bool)(bVar54 & 1) *
                                                                 auVar84._0_4_)))),auVar104);
      auVar189 = ZEXT3264(auVar101);
      auVar105 = vsubps_avx(auVar113,auVar108);
      auVar103 = vsubps_avx(auVar90,auVar109);
      auVar192 = ZEXT3264(auVar103);
      auVar102 = vsubps_avx(auVar104,auVar110);
      auVar89 = vsubps_avx(auVar108,auVar111);
      auVar92._4_4_ = auVar105._4_4_ * fVar129;
      auVar92._0_4_ = auVar105._0_4_ * fVar67;
      auVar92._8_4_ = auVar105._8_4_ * fVar131;
      auVar92._12_4_ = auVar105._12_4_ * fVar133;
      auVar92._16_4_ = auVar105._16_4_ * 0.0;
      auVar92._20_4_ = auVar105._20_4_ * 0.0;
      auVar92._24_4_ = auVar105._24_4_ * 0.0;
      auVar92._28_4_ = iVar2;
      auVar82 = vfmsub231ps_fma(auVar92,auVar108,auVar100);
      auVar93._4_4_ = fVar130 * auVar100._4_4_;
      auVar93._0_4_ = fVar68 * auVar100._0_4_;
      auVar93._8_4_ = fVar132 * auVar100._8_4_;
      auVar93._12_4_ = fVar134 * auVar100._12_4_;
      auVar93._16_4_ = auVar100._16_4_ * 0.0;
      auVar93._20_4_ = auVar100._20_4_ * 0.0;
      auVar93._24_4_ = auVar100._24_4_ * 0.0;
      auVar93._28_4_ = auVar99._28_4_;
      auVar85 = vfmsub231ps_fma(auVar93,auVar90,auVar101);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar97,ZEXT1632(auVar82));
      auVar180._0_4_ = auVar101._0_4_ * auVar108._0_4_;
      auVar180._4_4_ = auVar101._4_4_ * auVar108._4_4_;
      auVar180._8_4_ = auVar101._8_4_ * auVar108._8_4_;
      auVar180._12_4_ = auVar101._12_4_ * auVar108._12_4_;
      auVar180._16_4_ = auVar101._16_4_ * fVar194;
      auVar180._20_4_ = auVar101._20_4_ * fVar196;
      auVar180._24_4_ = auVar101._24_4_ * fVar197;
      auVar180._28_4_ = 0;
      auVar82 = vfmsub231ps_fma(auVar180,auVar104,auVar105);
      auVar91 = vfmadd231ps_avx512vl(auVar99,auVar97,ZEXT1632(auVar82));
      auVar99 = vmulps_avx512vl(auVar89,auVar109);
      auVar99 = vfmsub231ps_avx512vl(auVar99,auVar103,auVar111);
      auVar94._4_4_ = auVar102._4_4_ * auVar111._4_4_;
      auVar94._0_4_ = auVar102._0_4_ * auVar111._0_4_;
      auVar94._8_4_ = auVar102._8_4_ * auVar111._8_4_;
      auVar94._12_4_ = auVar102._12_4_ * auVar111._12_4_;
      auVar94._16_4_ = auVar102._16_4_ * auVar111._16_4_;
      auVar94._20_4_ = auVar102._20_4_ * auVar111._20_4_;
      auVar94._24_4_ = auVar102._24_4_ * auVar111._24_4_;
      auVar94._28_4_ = auVar111._28_4_;
      auVar82 = vfmsub231ps_fma(auVar94,auVar110,auVar89);
      auVar181._0_4_ = auVar110._0_4_ * auVar103._0_4_;
      auVar181._4_4_ = auVar110._4_4_ * auVar103._4_4_;
      auVar181._8_4_ = auVar110._8_4_ * auVar103._8_4_;
      auVar181._12_4_ = auVar110._12_4_ * auVar103._12_4_;
      auVar181._16_4_ = fVar165 * auVar103._16_4_;
      auVar181._20_4_ = fVar155 * auVar103._20_4_;
      auVar181._24_4_ = fVar164 * auVar103._24_4_;
      auVar181._28_4_ = 0;
      auVar85 = vfmsub231ps_fma(auVar181,auVar102,auVar109);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar97,auVar99);
      auVar92 = vfmadd231ps_avx512vl(auVar99,auVar97,ZEXT1632(auVar82));
      auVar184 = ZEXT3264(auVar92);
      auVar99 = vmaxps_avx(auVar91,auVar92);
      uVar151 = vcmpps_avx512vl(auVar99,auVar97,2);
      bVar64 = bVar64 & (byte)uVar151;
      if (bVar64 != 0) {
        auVar30._4_4_ = auVar89._4_4_ * auVar101._4_4_;
        auVar30._0_4_ = auVar89._0_4_ * auVar101._0_4_;
        auVar30._8_4_ = auVar89._8_4_ * auVar101._8_4_;
        auVar30._12_4_ = auVar89._12_4_ * auVar101._12_4_;
        auVar30._16_4_ = auVar89._16_4_ * auVar101._16_4_;
        auVar30._20_4_ = auVar89._20_4_ * auVar101._20_4_;
        auVar30._24_4_ = auVar89._24_4_ * auVar101._24_4_;
        auVar30._28_4_ = auVar99._28_4_;
        auVar83 = vfmsub231ps_fma(auVar30,auVar102,auVar105);
        auVar31._4_4_ = auVar105._4_4_ * auVar103._4_4_;
        auVar31._0_4_ = auVar105._0_4_ * auVar103._0_4_;
        auVar31._8_4_ = auVar105._8_4_ * auVar103._8_4_;
        auVar31._12_4_ = auVar105._12_4_ * auVar103._12_4_;
        auVar31._16_4_ = auVar105._16_4_ * auVar103._16_4_;
        auVar31._20_4_ = auVar105._20_4_ * auVar103._20_4_;
        auVar31._24_4_ = auVar105._24_4_ * auVar103._24_4_;
        auVar31._28_4_ = auVar105._28_4_;
        auVar84 = vfmsub231ps_fma(auVar31,auVar100,auVar89);
        auVar32._4_4_ = auVar102._4_4_ * auVar100._4_4_;
        auVar32._0_4_ = auVar102._0_4_ * auVar100._0_4_;
        auVar32._8_4_ = auVar102._8_4_ * auVar100._8_4_;
        auVar32._12_4_ = auVar102._12_4_ * auVar100._12_4_;
        auVar32._16_4_ = auVar102._16_4_ * auVar100._16_4_;
        auVar32._20_4_ = auVar102._20_4_ * auVar100._20_4_;
        auVar32._24_4_ = auVar102._24_4_ * auVar100._24_4_;
        auVar32._28_4_ = auVar102._28_4_;
        auVar17 = vfmsub231ps_fma(auVar32,auVar103,auVar101);
        auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar17));
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar83),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar99 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
        auVar23._8_4_ = 0x3f800000;
        auVar23._0_8_ = 0x3f8000003f800000;
        auVar23._12_4_ = 0x3f800000;
        auVar23._16_4_ = 0x3f800000;
        auVar23._20_4_ = 0x3f800000;
        auVar23._24_4_ = 0x3f800000;
        auVar23._28_4_ = 0x3f800000;
        auVar101 = vfnmadd213ps_avx512vl(auVar99,ZEXT1632(auVar85),auVar23);
        auVar82 = vfmadd132ps_fma(auVar101,auVar99,auVar99);
        auVar189 = ZEXT1664(auVar82);
        auVar33._4_4_ = auVar17._4_4_ * auVar108._4_4_;
        auVar33._0_4_ = auVar17._0_4_ * auVar108._0_4_;
        auVar33._8_4_ = auVar17._8_4_ * auVar108._8_4_;
        auVar33._12_4_ = auVar17._12_4_ * auVar108._12_4_;
        auVar33._16_4_ = fVar194 * 0.0;
        auVar33._20_4_ = fVar196 * 0.0;
        auVar33._24_4_ = fVar197 * 0.0;
        auVar33._28_4_ = iVar1;
        auVar84 = vfmadd231ps_fma(auVar33,auVar104,ZEXT1632(auVar84));
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar90,ZEXT1632(auVar83));
        fVar194 = auVar82._0_4_;
        fVar196 = auVar82._4_4_;
        fVar197 = auVar82._8_4_;
        fVar165 = auVar82._12_4_;
        fStack_4a4 = (float)auVar99._28_4_;
        _local_4c0 = ZEXT1628(CONCAT412(auVar84._12_4_ * fVar165,
                                        CONCAT48(auVar84._8_4_ * fVar197,
                                                 CONCAT44(auVar84._4_4_ * fVar196,
                                                          auVar84._0_4_ * fVar194))));
        auVar192 = ZEXT3264(_local_4c0);
        auVar142._4_4_ = local_480;
        auVar142._0_4_ = local_480;
        auVar142._8_4_ = local_480;
        auVar142._12_4_ = local_480;
        auVar142._16_4_ = local_480;
        auVar142._20_4_ = local_480;
        auVar142._24_4_ = local_480;
        auVar142._28_4_ = local_480;
        uVar151 = vcmpps_avx512vl(auVar142,_local_4c0,2);
        uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar24._4_4_ = uVar150;
        auVar24._0_4_ = uVar150;
        auVar24._8_4_ = uVar150;
        auVar24._12_4_ = uVar150;
        auVar24._16_4_ = uVar150;
        auVar24._20_4_ = uVar150;
        auVar24._24_4_ = uVar150;
        auVar24._28_4_ = uVar150;
        uVar20 = vcmpps_avx512vl(_local_4c0,auVar24,2);
        bVar64 = (byte)uVar151 & (byte)uVar20 & bVar64;
        if (bVar64 != 0) {
          uVar65 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar65 = bVar64 & uVar65;
          if ((char)uVar65 != '\0') {
            fVar155 = auVar91._0_4_ * fVar194;
            fVar164 = auVar91._4_4_ * fVar196;
            auVar34._4_4_ = fVar164;
            auVar34._0_4_ = fVar155;
            fVar67 = auVar91._8_4_ * fVar197;
            auVar34._8_4_ = fVar67;
            fVar68 = auVar91._12_4_ * fVar165;
            auVar34._12_4_ = fVar68;
            fVar129 = auVar91._16_4_ * 0.0;
            auVar34._16_4_ = fVar129;
            fVar130 = auVar91._20_4_ * 0.0;
            auVar34._20_4_ = fVar130;
            fVar131 = auVar91._24_4_ * 0.0;
            auVar34._24_4_ = fVar131;
            auVar34._28_4_ = auVar91._28_4_;
            auVar143._8_4_ = 0x3f800000;
            auVar143._0_8_ = 0x3f8000003f800000;
            auVar143._12_4_ = 0x3f800000;
            auVar143._16_4_ = 0x3f800000;
            auVar143._20_4_ = 0x3f800000;
            auVar143._24_4_ = 0x3f800000;
            auVar143._28_4_ = 0x3f800000;
            auVar99 = vsubps_avx(auVar143,auVar34);
            local_2c0._0_4_ =
                 (float)((uint)(bVar54 & 1) * (int)fVar155 |
                        (uint)!(bool)(bVar54 & 1) * auVar99._0_4_);
            bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar11 * (int)fVar164 | (uint)!bVar11 * auVar99._4_4_);
            bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar11 * (int)fVar67 | (uint)!bVar11 * auVar99._8_4_);
            bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar11 * (int)fVar68 | (uint)!bVar11 * auVar99._12_4_);
            bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
            local_2c0._16_4_ = (float)((uint)bVar11 * (int)fVar129 | (uint)!bVar11 * auVar99._16_4_)
            ;
            bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
            local_2c0._20_4_ = (float)((uint)bVar11 * (int)fVar130 | (uint)!bVar11 * auVar99._20_4_)
            ;
            bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
            local_2c0._24_4_ = (float)((uint)bVar11 * (int)fVar131 | (uint)!bVar11 * auVar99._24_4_)
            ;
            bVar11 = SUB81(uVar55 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar99._28_4_);
            auVar99 = vsubps_avx(ZEXT1632(auVar76),auVar96);
            auVar82 = vfmadd213ps_fma(auVar99,local_2c0,auVar96);
            uVar150 = *(undefined4 *)((long)local_548->ray_space + k * 4 + -0x10);
            auVar96._4_4_ = uVar150;
            auVar96._0_4_ = uVar150;
            auVar96._8_4_ = uVar150;
            auVar96._12_4_ = uVar150;
            auVar96._16_4_ = uVar150;
            auVar96._20_4_ = uVar150;
            auVar96._24_4_ = uVar150;
            auVar96._28_4_ = uVar150;
            auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                         CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                  CONCAT44(auVar82._4_4_ +
                                                                           auVar82._4_4_,
                                                                           auVar82._0_4_ +
                                                                           auVar82._0_4_)))),auVar96
                                     );
            uVar66 = vcmpps_avx512vl(_local_4c0,auVar99,6);
            uVar65 = uVar65 & uVar66;
            bVar64 = (byte)uVar65;
            if (bVar64 != 0) {
              auVar162._0_4_ = auVar92._0_4_ * fVar194;
              auVar162._4_4_ = auVar92._4_4_ * fVar196;
              auVar162._8_4_ = auVar92._8_4_ * fVar197;
              auVar162._12_4_ = auVar92._12_4_ * fVar165;
              auVar162._16_4_ = auVar92._16_4_ * 0.0;
              auVar162._20_4_ = auVar92._20_4_ * 0.0;
              auVar162._24_4_ = auVar92._24_4_ * 0.0;
              auVar162._28_4_ = 0;
              auVar175._8_4_ = 0x3f800000;
              auVar175._0_8_ = 0x3f8000003f800000;
              auVar175._12_4_ = 0x3f800000;
              auVar175._16_4_ = 0x3f800000;
              auVar175._20_4_ = 0x3f800000;
              auVar175._24_4_ = 0x3f800000;
              auVar175._28_4_ = 0x3f800000;
              auVar99 = vsubps_avx(auVar175,auVar162);
              auVar114._0_4_ =
                   (uint)(bVar54 & 1) * (int)auVar162._0_4_ |
                   (uint)!(bool)(bVar54 & 1) * auVar99._0_4_;
              bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
              auVar114._4_4_ = (uint)bVar11 * (int)auVar162._4_4_ | (uint)!bVar11 * auVar99._4_4_;
              bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
              auVar114._8_4_ = (uint)bVar11 * (int)auVar162._8_4_ | (uint)!bVar11 * auVar99._8_4_;
              bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
              auVar114._12_4_ = (uint)bVar11 * (int)auVar162._12_4_ | (uint)!bVar11 * auVar99._12_4_
              ;
              bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
              auVar114._16_4_ = (uint)bVar11 * (int)auVar162._16_4_ | (uint)!bVar11 * auVar99._16_4_
              ;
              bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
              auVar114._20_4_ = (uint)bVar11 * (int)auVar162._20_4_ | (uint)!bVar11 * auVar99._20_4_
              ;
              bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
              auVar114._24_4_ = (uint)bVar11 * (int)auVar162._24_4_ | (uint)!bVar11 * auVar99._24_4_
              ;
              auVar114._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar99._28_4_;
              auVar25._8_4_ = 0x40000000;
              auVar25._0_8_ = 0x4000000040000000;
              auVar25._12_4_ = 0x40000000;
              auVar25._16_4_ = 0x40000000;
              auVar25._20_4_ = 0x40000000;
              auVar25._24_4_ = 0x40000000;
              auVar25._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar114,auVar175,auVar25);
              local_280 = _local_4c0;
              local_260 = 0;
              local_25c = iVar6;
              local_250 = local_5b0._0_8_;
              uStack_248 = local_5b0._8_8_;
              local_240 = local_5d0._0_8_;
              uStack_238 = local_5d0._8_8_;
              local_230 = local_5e0._0_8_;
              uStack_228 = local_5e0._8_8_;
              local_220 = local_5c0;
              uStack_218 = uStack_5b8;
              if ((pGVar60->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar156 = 1.0 / auVar95._0_4_;
                local_200[0] = fVar156 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar156 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar156 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar156 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar156 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar156 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar156 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = _local_4c0;
                auVar144._8_4_ = 0x7f800000;
                auVar144._0_8_ = 0x7f8000007f800000;
                auVar144._12_4_ = 0x7f800000;
                auVar144._16_4_ = 0x7f800000;
                auVar144._20_4_ = 0x7f800000;
                auVar144._24_4_ = 0x7f800000;
                auVar144._28_4_ = 0x7f800000;
                auVar99 = vblendmps_avx512vl(auVar144,_local_4c0);
                auVar115._0_4_ =
                     (uint)(bVar64 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
                bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
                auVar115._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                auVar115._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
                auVar115._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
                auVar115._16_4_ = (uint)bVar11 * auVar99._16_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
                auVar115._20_4_ = (uint)bVar11 * auVar99._20_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
                auVar115._24_4_ = (uint)bVar11 * auVar99._24_4_ | (uint)!bVar11 * 0x7f800000;
                bVar11 = SUB81(uVar65 >> 7,0);
                auVar115._28_4_ = (uint)bVar11 * auVar99._28_4_ | (uint)!bVar11 * 0x7f800000;
                auVar99 = vshufps_avx(auVar115,auVar115,0xb1);
                auVar99 = vminps_avx(auVar115,auVar99);
                auVar101 = vshufpd_avx(auVar99,auVar99,5);
                auVar99 = vminps_avx(auVar99,auVar101);
                auVar101 = vpermpd_avx2(auVar99,0x4e);
                auVar99 = vminps_avx(auVar99,auVar101);
                uVar151 = vcmpps_avx512vl(auVar115,auVar99,0);
                uVar56 = (uint)uVar65;
                if ((bVar64 & (byte)uVar151) != 0) {
                  uVar56 = (uint)(bVar64 & (byte)uVar151);
                }
                uVar21 = 0;
                for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
                  uVar21 = uVar21 + 1;
                }
                uVar55 = (ulong)uVar21;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar60->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_4a0._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  do {
                    local_420 = local_200[uVar55];
                    local_410 = *(undefined4 *)(local_1e0 + uVar55 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar55 * 4);
                    local_5a0.context = context->user;
                    fVar194 = 1.0 - local_420;
                    fVar156 = fVar194 * fVar194 * -3.0;
                    auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar194 * fVar194)),
                                              ZEXT416((uint)(local_420 * fVar194)),
                                              ZEXT416(0xc0000000));
                    auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar194)),
                                              ZEXT416((uint)(local_420 * local_420)),
                                              ZEXT416(0x40000000));
                    fVar194 = auVar82._0_4_ * 3.0;
                    fVar196 = auVar85._0_4_ * 3.0;
                    fVar197 = local_420 * local_420 * 3.0;
                    auVar188._0_4_ = fVar197 * (float)local_5c0._0_4_;
                    auVar188._4_4_ = fVar197 * (float)local_5c0._4_4_;
                    auVar188._8_4_ = fVar197 * (float)uStack_5b8;
                    auVar188._12_4_ = fVar197 * uStack_5b8._4_4_;
                    auVar189 = ZEXT1664(auVar188);
                    auVar140._4_4_ = fVar196;
                    auVar140._0_4_ = fVar196;
                    auVar140._8_4_ = fVar196;
                    auVar140._12_4_ = fVar196;
                    auVar82 = vfmadd132ps_fma(auVar140,auVar188,local_5e0);
                    auVar174._4_4_ = fVar194;
                    auVar174._0_4_ = fVar194;
                    auVar174._8_4_ = fVar194;
                    auVar174._12_4_ = fVar194;
                    auVar82 = vfmadd132ps_fma(auVar174,auVar82,local_5d0);
                    auVar141._4_4_ = fVar156;
                    auVar141._0_4_ = fVar156;
                    auVar141._8_4_ = fVar156;
                    auVar141._12_4_ = fVar156;
                    auVar82 = vfmadd132ps_fma(auVar141,auVar82,local_5b0);
                    local_450 = auVar82._0_4_;
                    local_440 = vshufps_avx(auVar82,auVar82,0x55);
                    auVar184 = ZEXT1664(local_440);
                    local_430 = vshufps_avx(auVar82,auVar82,0xaa);
                    iStack_44c = local_450;
                    iStack_448 = local_450;
                    iStack_444 = local_450;
                    fStack_41c = local_420;
                    fStack_418 = local_420;
                    fStack_414 = local_420;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    local_400 = local_4e0._0_8_;
                    uStack_3f8 = local_4e0._8_8_;
                    local_3f0 = local_4d0;
                    vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                    uStack_3dc = (local_5a0.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_5a0.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_600 = local_4f0;
                    local_5a0.valid = (int *)local_600;
                    local_5a0.geometryUserPtr = pGVar60->userPtr;
                    local_5a0.hit = (RTCHitN *)&local_450;
                    local_5a0.N = 4;
                    local_5a0.ray = (RTCRayN *)ray;
                    if (pGVar60->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar184 = ZEXT1664(local_440);
                      auVar189 = ZEXT1664(auVar188);
                      (*pGVar60->intersectionFilterN)(&local_5a0);
                      auVar192 = ZEXT3264(_local_4c0);
                      auVar82 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                      auVar214 = ZEXT1664(auVar82);
                      auVar213 = ZEXT464(0xbf800000);
                      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar212 = ZEXT1664(auVar82);
                      k = local_550;
                    }
                    uVar66 = vptestmd_avx512vl(local_600,local_600);
                    if ((uVar66 & 0xf) == 0) {
LAB_0191e85c:
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_4a0._0_4_;
                    }
                    else {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar60->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar184 = ZEXT1664(auVar184._0_16_);
                        auVar189 = ZEXT1664(auVar189._0_16_);
                        (*p_Var10)(&local_5a0);
                        auVar192 = ZEXT3264(_local_4c0);
                        auVar82 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                        auVar214 = ZEXT1664(auVar82);
                        auVar213 = ZEXT464(0xbf800000);
                        auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar212 = ZEXT1664(auVar82);
                        k = local_550;
                      }
                      uVar66 = vptestmd_avx512vl(local_600,local_600);
                      uVar66 = uVar66 & 0xf;
                      bVar64 = (byte)uVar66;
                      if (bVar64 == 0) goto LAB_0191e85c;
                      iVar1 = *(int *)(local_5a0.hit + 4);
                      iVar2 = *(int *)(local_5a0.hit + 8);
                      iVar52 = *(int *)(local_5a0.hit + 0xc);
                      bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                      bVar13 = SUB81(uVar66 >> 3,0);
                      *(uint *)(local_5a0.ray + 0xc0) =
                           (uint)(bVar64 & 1) * *(int *)local_5a0.hit |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0xc0);
                      *(uint *)(local_5a0.ray + 0xc4) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0xc4);
                      *(uint *)(local_5a0.ray + 200) =
                           (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 200);
                      *(uint *)(local_5a0.ray + 0xcc) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xcc);
                      iVar1 = *(int *)(local_5a0.hit + 0x14);
                      iVar2 = *(int *)(local_5a0.hit + 0x18);
                      iVar52 = *(int *)(local_5a0.hit + 0x1c);
                      bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                      bVar13 = SUB81(uVar66 >> 3,0);
                      *(uint *)(local_5a0.ray + 0xd0) =
                           (uint)(bVar64 & 1) * *(int *)(local_5a0.hit + 0x10) |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0xd0);
                      *(uint *)(local_5a0.ray + 0xd4) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0xd4);
                      *(uint *)(local_5a0.ray + 0xd8) =
                           (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xd8);
                      *(uint *)(local_5a0.ray + 0xdc) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xdc);
                      iVar1 = *(int *)(local_5a0.hit + 0x24);
                      iVar2 = *(int *)(local_5a0.hit + 0x28);
                      iVar52 = *(int *)(local_5a0.hit + 0x2c);
                      bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                      bVar13 = SUB81(uVar66 >> 3,0);
                      *(uint *)(local_5a0.ray + 0xe0) =
                           (uint)(bVar64 & 1) * *(int *)(local_5a0.hit + 0x20) |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0xe0);
                      *(uint *)(local_5a0.ray + 0xe4) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0xe4);
                      *(uint *)(local_5a0.ray + 0xe8) =
                           (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xe8);
                      *(uint *)(local_5a0.ray + 0xec) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xec);
                      iVar1 = *(int *)(local_5a0.hit + 0x34);
                      iVar2 = *(int *)(local_5a0.hit + 0x38);
                      iVar52 = *(int *)(local_5a0.hit + 0x3c);
                      bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                      bVar13 = SUB81(uVar66 >> 3,0);
                      *(uint *)(local_5a0.ray + 0xf0) =
                           (uint)(bVar64 & 1) * *(int *)(local_5a0.hit + 0x30) |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0xf0);
                      *(uint *)(local_5a0.ray + 0xf4) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0xf4);
                      *(uint *)(local_5a0.ray + 0xf8) =
                           (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xf8);
                      *(uint *)(local_5a0.ray + 0xfc) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0xfc);
                      iVar1 = *(int *)(local_5a0.hit + 0x44);
                      iVar2 = *(int *)(local_5a0.hit + 0x48);
                      iVar52 = *(int *)(local_5a0.hit + 0x4c);
                      bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                      bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                      bVar13 = SUB81(uVar66 >> 3,0);
                      *(uint *)(local_5a0.ray + 0x100) =
                           (uint)(bVar64 & 1) * *(int *)(local_5a0.hit + 0x40) |
                           (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0x100);
                      *(uint *)(local_5a0.ray + 0x104) =
                           (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0x104);
                      *(uint *)(local_5a0.ray + 0x108) =
                           (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0x108);
                      *(uint *)(local_5a0.ray + 0x10c) =
                           (uint)bVar13 * iVar52 | (uint)!bVar13 * *(int *)(local_5a0.ray + 0x10c);
                      auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50));
                      *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar82;
                      auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60));
                      *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar82;
                      auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70));
                      *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar82;
                      auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80));
                      *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar82;
                      local_4a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_4a0._4_4_ = 0;
                      local_4a0._8_4_ = 0;
                      local_4a0._12_4_ = 0;
                    }
                    bVar64 = ~(byte)(1 << ((uint)uVar55 & 0x1f)) & (byte)uVar65;
                    auVar148._4_4_ = local_4a0._0_4_;
                    auVar148._0_4_ = local_4a0._0_4_;
                    auVar148._8_4_ = local_4a0._0_4_;
                    auVar148._12_4_ = local_4a0._0_4_;
                    auVar148._16_4_ = local_4a0._0_4_;
                    auVar148._20_4_ = local_4a0._0_4_;
                    auVar148._24_4_ = local_4a0._0_4_;
                    auVar148._28_4_ = local_4a0._0_4_;
                    uVar151 = vcmpps_avx512vl(auVar192._0_32_,auVar148,2);
                    if ((bVar64 & (byte)uVar151) == 0) goto LAB_0191d83a;
                    bVar64 = bVar64 & (byte)uVar151;
                    uVar65 = (ulong)bVar64;
                    auVar149._8_4_ = 0x7f800000;
                    auVar149._0_8_ = 0x7f8000007f800000;
                    auVar149._12_4_ = 0x7f800000;
                    auVar149._16_4_ = 0x7f800000;
                    auVar149._20_4_ = 0x7f800000;
                    auVar149._24_4_ = 0x7f800000;
                    auVar149._28_4_ = 0x7f800000;
                    auVar99 = vblendmps_avx512vl(auVar149,auVar192._0_32_);
                    auVar128._0_4_ =
                         (uint)(bVar64 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000
                    ;
                    bVar11 = (bool)(bVar64 >> 1 & 1);
                    auVar128._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar64 >> 2 & 1);
                    auVar128._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar64 >> 3 & 1);
                    auVar128._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar64 >> 4 & 1);
                    auVar128._16_4_ = (uint)bVar11 * auVar99._16_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar64 >> 5 & 1);
                    auVar128._20_4_ = (uint)bVar11 * auVar99._20_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar64 >> 6 & 1);
                    auVar128._24_4_ = (uint)bVar11 * auVar99._24_4_ | (uint)!bVar11 * 0x7f800000;
                    auVar128._28_4_ =
                         (uint)(bVar64 >> 7) * auVar99._28_4_ |
                         (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
                    auVar99 = vshufps_avx(auVar128,auVar128,0xb1);
                    auVar99 = vminps_avx(auVar128,auVar99);
                    auVar101 = vshufpd_avx(auVar99,auVar99,5);
                    auVar99 = vminps_avx(auVar99,auVar101);
                    auVar101 = vpermpd_avx2(auVar99,0x4e);
                    auVar99 = vminps_avx(auVar99,auVar101);
                    uVar151 = vcmpps_avx512vl(auVar128,auVar99,0);
                    bVar54 = (byte)uVar151 & bVar64;
                    if (bVar54 != 0) {
                      bVar64 = bVar54;
                    }
                    uVar63 = 0;
                    for (uVar57 = (uint)bVar64; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x80000000
                        ) {
                      uVar63 = uVar63 + 1;
                    }
                    uVar55 = (ulong)uVar63;
                  } while( true );
                }
                fVar156 = local_200[uVar55];
                uVar150 = *(undefined4 *)(local_1e0 + uVar55 * 4);
                fVar196 = 1.0 - fVar156;
                fVar194 = fVar196 * fVar196 * -3.0;
                auVar184 = ZEXT464((uint)fVar194);
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                          ZEXT416((uint)(fVar156 * fVar196)),ZEXT416(0xc0000000));
                auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar156 * fVar196)),
                                          ZEXT416((uint)(fVar156 * fVar156)),ZEXT416(0x40000000));
                fVar196 = auVar82._0_4_ * 3.0;
                fVar197 = auVar85._0_4_ * 3.0;
                fVar165 = fVar156 * fVar156 * 3.0;
                auVar185._0_4_ = fVar165 * (float)local_5c0._0_4_;
                auVar185._4_4_ = fVar165 * (float)local_5c0._4_4_;
                auVar185._8_4_ = fVar165 * (float)uStack_5b8;
                auVar185._12_4_ = fVar165 * uStack_5b8._4_4_;
                auVar189 = ZEXT1664(auVar185);
                auVar158._4_4_ = fVar197;
                auVar158._0_4_ = fVar197;
                auVar158._8_4_ = fVar197;
                auVar158._12_4_ = fVar197;
                auVar82 = vfmadd132ps_fma(auVar158,auVar185,local_5e0);
                auVar171._4_4_ = fVar196;
                auVar171._0_4_ = fVar196;
                auVar171._8_4_ = fVar196;
                auVar171._12_4_ = fVar196;
                auVar82 = vfmadd132ps_fma(auVar171,auVar82,local_5d0);
                auVar159._4_4_ = fVar194;
                auVar159._0_4_ = fVar194;
                auVar159._8_4_ = fVar194;
                auVar159._12_4_ = fVar194;
                auVar82 = vfmadd132ps_fma(auVar159,auVar82,local_5b0);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar55 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar82._0_4_;
                uVar7 = vextractps_avx(auVar82,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar7;
                uVar7 = vextractps_avx(auVar82,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar7;
                *(float *)(ray + k * 4 + 0xf0) = fVar156;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar150;
                *(uint *)(ray + k * 4 + 0x110) = uVar57;
                *(uint *)(ray + k * 4 + 0x120) = uVar63;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
LAB_0191d83a:
                prim = local_5f0;
                fVar156 = (float)local_570._0_4_;
              }
            }
          }
        }
      }
    }
    local_570._0_4_ = fVar156;
    if (8 < iVar6) {
      local_4a0 = vpbroadcastd_avx512vl();
      local_4c0._4_4_ = local_570._0_4_;
      local_4c0._0_4_ = local_570._0_4_;
      fStack_4b8 = (float)local_570._0_4_;
      fStack_4b4 = (float)local_570._0_4_;
      fStack_4b0 = (float)local_570._0_4_;
      fStack_4ac = (float)local_570._0_4_;
      fStack_4a8 = (float)local_570._0_4_;
      fStack_4a4 = (float)local_570._0_4_;
      uStack_47c = local_480;
      uStack_478 = local_480;
      uStack_474 = local_480;
      uStack_470 = local_480;
      uStack_46c = local_480;
      uStack_468 = local_480;
      uStack_464 = local_480;
      local_100 = 1.0 / (float)local_520._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar59 = 8;
LAB_0191d8c9:
      if (lVar59 < lVar61) {
        auVar99 = vpbroadcastd_avx512vl();
        auVar99 = vpor_avx2(auVar99,_DAT_01fb4ba0);
        uVar20 = vpcmpd_avx512vl(auVar99,local_4a0,1);
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar59 * 4 + lVar62);
        auVar101 = *(undefined1 (*) [32])(lVar62 + 0x21fb768 + lVar59 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar62 + 0x21fbbec + lVar59 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar62 + 0x21fc070 + lVar59 * 4);
        auVar190._0_4_ = auVar103._0_4_ * (float)local_3a0._0_4_;
        auVar190._4_4_ = auVar103._4_4_ * (float)local_3a0._4_4_;
        auVar190._8_4_ = auVar103._8_4_ * fStack_398;
        auVar190._12_4_ = auVar103._12_4_ * fStack_394;
        auVar190._16_4_ = auVar103._16_4_ * fStack_390;
        auVar190._20_4_ = auVar103._20_4_ * fStack_38c;
        auVar190._28_36_ = auVar189._28_36_;
        auVar190._24_4_ = auVar103._24_4_ * fStack_388;
        auVar189._0_4_ = auVar103._0_4_ * (float)local_3c0._0_4_;
        auVar189._4_4_ = auVar103._4_4_ * (float)local_3c0._4_4_;
        auVar189._8_4_ = auVar103._8_4_ * fStack_3b8;
        auVar189._12_4_ = auVar103._12_4_ * fStack_3b4;
        auVar189._16_4_ = auVar103._16_4_ * fStack_3b0;
        auVar189._20_4_ = auVar103._20_4_ * fStack_3ac;
        auVar189._28_36_ = auVar184._28_36_;
        auVar189._24_4_ = auVar103._24_4_ * fStack_3a8;
        auVar102 = vmulps_avx512vl(local_e0,auVar103);
        auVar89 = vfmadd231ps_avx512vl(auVar190._0_32_,auVar105,local_360);
        auVar90 = vfmadd231ps_avx512vl(auVar189._0_32_,auVar105,local_380);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar105,local_c0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar101,local_320);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar101,local_340);
        auVar104 = vfmadd231ps_avx512vl(auVar102,auVar101,local_a0);
        auVar82 = vfmadd231ps_fma(auVar89,auVar99,local_2e0);
        auVar189 = ZEXT1664(auVar82);
        auVar85 = vfmadd231ps_fma(auVar90,auVar99,local_300);
        auVar184 = ZEXT1664(auVar85);
        auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar59 * 4 + lVar62);
        auVar89 = *(undefined1 (*) [32])(lVar62 + 0x21fdb88 + lVar59 * 4);
        auVar92 = vfmadd231ps_avx512vl(auVar104,auVar99,local_80);
        auVar90 = *(undefined1 (*) [32])(lVar62 + 0x21fe00c + lVar59 * 4);
        auVar104 = *(undefined1 (*) [32])(lVar62 + 0x21fe490 + lVar59 * 4);
        auVar193._0_4_ = auVar104._0_4_ * (float)local_3a0._0_4_;
        auVar193._4_4_ = auVar104._4_4_ * (float)local_3a0._4_4_;
        auVar193._8_4_ = auVar104._8_4_ * fStack_398;
        auVar193._12_4_ = auVar104._12_4_ * fStack_394;
        auVar193._16_4_ = auVar104._16_4_ * fStack_390;
        auVar193._20_4_ = auVar104._20_4_ * fStack_38c;
        auVar193._28_36_ = auVar192._28_36_;
        auVar193._24_4_ = auVar104._24_4_ * fStack_388;
        auVar35._4_4_ = auVar104._4_4_ * (float)local_3c0._4_4_;
        auVar35._0_4_ = auVar104._0_4_ * (float)local_3c0._0_4_;
        auVar35._8_4_ = auVar104._8_4_ * fStack_3b8;
        auVar35._12_4_ = auVar104._12_4_ * fStack_3b4;
        auVar35._16_4_ = auVar104._16_4_ * fStack_3b0;
        auVar35._20_4_ = auVar104._20_4_ * fStack_3ac;
        auVar35._24_4_ = auVar104._24_4_ * fStack_3a8;
        auVar35._28_4_ = uStack_3a4;
        auVar100 = vmulps_avx512vl(local_e0,auVar104);
        auVar91 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar90,local_360);
        auVar93 = vfmadd231ps_avx512vl(auVar35,auVar90,local_380);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar90,local_c0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,local_320);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_340);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar89,local_a0);
        auVar84 = vfmadd231ps_fma(auVar91,auVar102,local_2e0);
        auVar192 = ZEXT1664(auVar84);
        auVar83 = vfmadd231ps_fma(auVar93,auVar102,local_300);
        auVar93 = vfmadd231ps_avx512vl(auVar100,auVar102,local_80);
        auVar94 = vmaxps_avx512vl(auVar92,auVar93);
        auVar100 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar82));
        auVar91 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar85));
        auVar95 = vmulps_avx512vl(ZEXT1632(auVar85),auVar100);
        auVar96 = vmulps_avx512vl(ZEXT1632(auVar82),auVar91);
        auVar95 = vsubps_avx512vl(auVar95,auVar96);
        auVar96 = vmulps_avx512vl(auVar91,auVar91);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar100);
        auVar94 = vmulps_avx512vl(auVar94,auVar94);
        auVar94 = vmulps_avx512vl(auVar94,auVar96);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        uVar151 = vcmpps_avx512vl(auVar95,auVar94,2);
        bVar64 = (byte)uVar20 & (byte)uVar151;
        if (bVar64 != 0) {
          auVar104 = vmulps_avx512vl(local_180,auVar104);
          auVar90 = vfmadd213ps_avx512vl(auVar90,local_160,auVar104);
          auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar90);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_120,auVar89);
          auVar103 = vmulps_avx512vl(local_180,auVar103);
          auVar105 = vfmadd213ps_avx512vl(auVar105,local_160,auVar103);
          auVar101 = vfmadd213ps_avx512vl(auVar101,local_140,auVar105);
          auVar89 = vfmadd213ps_avx512vl(auVar99,local_120,auVar101);
          auVar99 = *(undefined1 (*) [32])(lVar62 + 0x21fc4f4 + lVar59 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar62 + 0x21fc978 + lVar59 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar62 + 0x21fcdfc + lVar59 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar62 + 0x21fd280 + lVar59 * 4);
          auVar90 = vmulps_avx512vl(_local_3a0,auVar103);
          auVar104 = vmulps_avx512vl(_local_3c0,auVar103);
          auVar103 = vmulps_avx512vl(local_180,auVar103);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar105,local_360);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar105,local_380);
          auVar105 = vfmadd231ps_avx512vl(auVar103,local_160,auVar105);
          auVar103 = vfmadd231ps_avx512vl(auVar90,auVar101,local_320);
          auVar90 = vfmadd231ps_avx512vl(auVar104,auVar101,local_340);
          auVar101 = vfmadd231ps_avx512vl(auVar105,local_140,auVar101);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar99,local_2e0);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar99,local_300);
          auVar104 = vfmadd231ps_avx512vl(auVar101,local_120,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar62 + 0x21fe914 + lVar59 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar62 + 0x21ff21c + lVar59 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar62 + 0x21ff6a0 + lVar59 * 4);
          auVar94 = vmulps_avx512vl(_local_3a0,auVar105);
          auVar95 = vmulps_avx512vl(_local_3c0,auVar105);
          auVar105 = vmulps_avx512vl(local_180,auVar105);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_360);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_380);
          auVar105 = vfmadd231ps_avx512vl(auVar105,local_160,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar62 + 0x21fed98 + lVar59 * 4);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_320);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar101,local_340);
          auVar101 = vfmadd231ps_avx512vl(auVar105,local_140,auVar101);
          auVar105 = vfmadd231ps_avx512vl(auVar94,auVar99,local_2e0);
          auVar94 = vfmadd231ps_avx512vl(auVar95,auVar99,local_300);
          auVar101 = vfmadd231ps_avx512vl(auVar101,local_120,auVar99);
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar103,auVar95);
          vandps_avx512vl(auVar90,auVar95);
          auVar99 = vmaxps_avx(auVar95,auVar95);
          vandps_avx512vl(auVar104,auVar95);
          auVar99 = vmaxps_avx(auVar99,auVar95);
          uVar55 = vcmpps_avx512vl(auVar99,_local_4c0,1);
          bVar11 = (bool)((byte)uVar55 & 1);
          auVar116._0_4_ = (float)((uint)bVar11 * auVar100._0_4_ | (uint)!bVar11 * auVar103._0_4_);
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar103._4_4_);
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar103._8_4_);
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar116._12_4_ =
               (float)((uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar103._12_4_);
          bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar116._16_4_ =
               (float)((uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * auVar103._16_4_);
          bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar116._20_4_ =
               (float)((uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * auVar103._20_4_);
          bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar116._24_4_ =
               (float)((uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * auVar103._24_4_);
          bVar11 = SUB81(uVar55 >> 7,0);
          auVar116._28_4_ = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * auVar103._28_4_;
          bVar11 = (bool)((byte)uVar55 & 1);
          auVar117._0_4_ = (float)((uint)bVar11 * auVar91._0_4_ | (uint)!bVar11 * auVar90._0_4_);
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar11 * auVar91._4_4_ | (uint)!bVar11 * auVar90._4_4_);
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * auVar90._8_4_);
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar11 * auVar91._12_4_ | (uint)!bVar11 * auVar90._12_4_);
          bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar11 * auVar91._16_4_ | (uint)!bVar11 * auVar90._16_4_);
          bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar11 * auVar91._20_4_ | (uint)!bVar11 * auVar90._20_4_);
          bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar11 * auVar91._24_4_ | (uint)!bVar11 * auVar90._24_4_);
          bVar11 = SUB81(uVar55 >> 7,0);
          auVar117._28_4_ = (uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar90._28_4_;
          vandps_avx512vl(auVar105,auVar95);
          vandps_avx512vl(auVar94,auVar95);
          auVar99 = vmaxps_avx(auVar117,auVar117);
          vandps_avx512vl(auVar101,auVar95);
          auVar99 = vmaxps_avx(auVar99,auVar117);
          uVar55 = vcmpps_avx512vl(auVar99,_local_4c0,1);
          bVar11 = (bool)((byte)uVar55 & 1);
          auVar118._0_4_ = (uint)bVar11 * auVar100._0_4_ | (uint)!bVar11 * auVar105._0_4_;
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar118._4_4_ = (uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar105._4_4_;
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar118._8_4_ = (uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar105._8_4_;
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar118._12_4_ = (uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar105._12_4_;
          bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar118._16_4_ = (uint)bVar11 * auVar100._16_4_ | (uint)!bVar11 * auVar105._16_4_;
          bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar118._20_4_ = (uint)bVar11 * auVar100._20_4_ | (uint)!bVar11 * auVar105._20_4_;
          bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar118._24_4_ = (uint)bVar11 * auVar100._24_4_ | (uint)!bVar11 * auVar105._24_4_;
          bVar11 = SUB81(uVar55 >> 7,0);
          auVar118._28_4_ = (uint)bVar11 * auVar100._28_4_ | (uint)!bVar11 * auVar105._28_4_;
          bVar11 = (bool)((byte)uVar55 & 1);
          auVar119._0_4_ = (float)((uint)bVar11 * auVar91._0_4_ | (uint)!bVar11 * auVar94._0_4_);
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar11 * auVar91._4_4_ | (uint)!bVar11 * auVar94._4_4_);
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar11 * auVar91._8_4_ | (uint)!bVar11 * auVar94._8_4_);
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar11 * auVar91._12_4_ | (uint)!bVar11 * auVar94._12_4_);
          bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar11 * auVar91._16_4_ | (uint)!bVar11 * auVar94._16_4_);
          bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar11 * auVar91._20_4_ | (uint)!bVar11 * auVar94._20_4_);
          bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar11 * auVar91._24_4_ | (uint)!bVar11 * auVar94._24_4_);
          bVar11 = SUB81(uVar55 >> 7,0);
          auVar119._28_4_ = (uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar94._28_4_;
          auVar199._8_4_ = 0x80000000;
          auVar199._0_8_ = 0x8000000080000000;
          auVar199._12_4_ = 0x80000000;
          auVar199._16_4_ = 0x80000000;
          auVar199._20_4_ = 0x80000000;
          auVar199._24_4_ = 0x80000000;
          auVar199._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar118,auVar199);
          auVar88 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
          auVar101 = vfmadd213ps_avx512vl(auVar116,auVar116,ZEXT1632(auVar88));
          auVar17 = vfmadd231ps_fma(auVar101,auVar117,auVar117);
          auVar101 = vrsqrt14ps_avx512vl(ZEXT1632(auVar17));
          auVar211._8_4_ = 0xbf000000;
          auVar211._0_8_ = 0xbf000000bf000000;
          auVar211._12_4_ = 0xbf000000;
          auVar211._16_4_ = 0xbf000000;
          auVar211._20_4_ = 0xbf000000;
          auVar211._24_4_ = 0xbf000000;
          auVar211._28_4_ = 0xbf000000;
          fVar156 = auVar101._0_4_;
          fVar194 = auVar101._4_4_;
          fVar196 = auVar101._8_4_;
          fVar197 = auVar101._12_4_;
          fVar165 = auVar101._16_4_;
          fVar155 = auVar101._20_4_;
          fVar164 = auVar101._24_4_;
          auVar36._4_4_ = fVar194 * fVar194 * fVar194 * auVar17._4_4_ * -0.5;
          auVar36._0_4_ = fVar156 * fVar156 * fVar156 * auVar17._0_4_ * -0.5;
          auVar36._8_4_ = fVar196 * fVar196 * fVar196 * auVar17._8_4_ * -0.5;
          auVar36._12_4_ = fVar197 * fVar197 * fVar197 * auVar17._12_4_ * -0.5;
          auVar36._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
          auVar36._20_4_ = fVar155 * fVar155 * fVar155 * -0.0;
          auVar36._24_4_ = fVar164 * fVar164 * fVar164 * -0.0;
          auVar36._28_4_ = auVar117._28_4_;
          auVar105 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar101 = vfmadd231ps_avx512vl(auVar36,auVar105,auVar101);
          auVar37._4_4_ = auVar117._4_4_ * auVar101._4_4_;
          auVar37._0_4_ = auVar117._0_4_ * auVar101._0_4_;
          auVar37._8_4_ = auVar117._8_4_ * auVar101._8_4_;
          auVar37._12_4_ = auVar117._12_4_ * auVar101._12_4_;
          auVar37._16_4_ = auVar117._16_4_ * auVar101._16_4_;
          auVar37._20_4_ = auVar117._20_4_ * auVar101._20_4_;
          auVar37._24_4_ = auVar117._24_4_ * auVar101._24_4_;
          auVar37._28_4_ = 0;
          auVar38._4_4_ = auVar101._4_4_ * -auVar116._4_4_;
          auVar38._0_4_ = auVar101._0_4_ * -auVar116._0_4_;
          auVar38._8_4_ = auVar101._8_4_ * -auVar116._8_4_;
          auVar38._12_4_ = auVar101._12_4_ * -auVar116._12_4_;
          auVar38._16_4_ = auVar101._16_4_ * -auVar116._16_4_;
          auVar38._20_4_ = auVar101._20_4_ * -auVar116._20_4_;
          auVar38._24_4_ = auVar101._24_4_ * -auVar116._24_4_;
          auVar38._28_4_ = auVar117._28_4_;
          auVar103 = vmulps_avx512vl(auVar101,ZEXT1632(auVar88));
          auVar104 = ZEXT1632(auVar88);
          auVar101 = vfmadd213ps_avx512vl(auVar118,auVar118,auVar104);
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar119,auVar119);
          auVar90 = vrsqrt14ps_avx512vl(auVar101);
          auVar101 = vmulps_avx512vl(auVar101,auVar211);
          fVar156 = auVar90._0_4_;
          fVar194 = auVar90._4_4_;
          fVar196 = auVar90._8_4_;
          fVar197 = auVar90._12_4_;
          fVar165 = auVar90._16_4_;
          fVar155 = auVar90._20_4_;
          fVar164 = auVar90._24_4_;
          auVar39._4_4_ = fVar194 * fVar194 * fVar194 * auVar101._4_4_;
          auVar39._0_4_ = fVar156 * fVar156 * fVar156 * auVar101._0_4_;
          auVar39._8_4_ = fVar196 * fVar196 * fVar196 * auVar101._8_4_;
          auVar39._12_4_ = fVar197 * fVar197 * fVar197 * auVar101._12_4_;
          auVar39._16_4_ = fVar165 * fVar165 * fVar165 * auVar101._16_4_;
          auVar39._20_4_ = fVar155 * fVar155 * fVar155 * auVar101._20_4_;
          auVar39._24_4_ = fVar164 * fVar164 * fVar164 * auVar101._24_4_;
          auVar39._28_4_ = auVar101._28_4_;
          auVar101 = vfmadd231ps_avx512vl(auVar39,auVar105,auVar90);
          auVar40._4_4_ = auVar119._4_4_ * auVar101._4_4_;
          auVar40._0_4_ = auVar119._0_4_ * auVar101._0_4_;
          auVar40._8_4_ = auVar119._8_4_ * auVar101._8_4_;
          auVar40._12_4_ = auVar119._12_4_ * auVar101._12_4_;
          auVar40._16_4_ = auVar119._16_4_ * auVar101._16_4_;
          auVar40._20_4_ = auVar119._20_4_ * auVar101._20_4_;
          auVar40._24_4_ = auVar119._24_4_ * auVar101._24_4_;
          auVar40._28_4_ = auVar90._28_4_;
          auVar41._4_4_ = auVar101._4_4_ * auVar99._4_4_;
          auVar41._0_4_ = auVar101._0_4_ * auVar99._0_4_;
          auVar41._8_4_ = auVar101._8_4_ * auVar99._8_4_;
          auVar41._12_4_ = auVar101._12_4_ * auVar99._12_4_;
          auVar41._16_4_ = auVar101._16_4_ * auVar99._16_4_;
          auVar41._20_4_ = auVar101._20_4_ * auVar99._20_4_;
          auVar41._24_4_ = auVar101._24_4_ * auVar99._24_4_;
          auVar41._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(auVar101,auVar104);
          auVar17 = vfmadd213ps_fma(auVar37,auVar92,ZEXT1632(auVar82));
          auVar78 = vfmadd213ps_fma(auVar38,auVar92,ZEXT1632(auVar85));
          auVar105 = vfmadd213ps_avx512vl(auVar103,auVar92,auVar89);
          auVar90 = vfmadd213ps_avx512vl(auVar40,auVar93,ZEXT1632(auVar84));
          auVar75 = vfnmadd213ps_fma(auVar37,auVar92,ZEXT1632(auVar82));
          auVar82 = vfmadd213ps_fma(auVar41,auVar93,ZEXT1632(auVar83));
          auVar76 = vfnmadd213ps_fma(auVar38,auVar92,ZEXT1632(auVar85));
          auVar85 = vfmadd213ps_fma(auVar99,auVar93,auVar102);
          auVar80 = vfnmadd231ps_fma(auVar89,auVar92,auVar103);
          auVar77 = vfnmadd213ps_fma(auVar40,auVar93,ZEXT1632(auVar84));
          auVar79 = vfnmadd213ps_fma(auVar41,auVar93,ZEXT1632(auVar83));
          auVar81 = vfnmadd231ps_fma(auVar102,auVar93,auVar99);
          auVar102 = vsubps_avx512vl(auVar90,ZEXT1632(auVar75));
          auVar99 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar76));
          auVar101 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar80));
          auVar42._4_4_ = auVar99._4_4_ * auVar80._4_4_;
          auVar42._0_4_ = auVar99._0_4_ * auVar80._0_4_;
          auVar42._8_4_ = auVar99._8_4_ * auVar80._8_4_;
          auVar42._12_4_ = auVar99._12_4_ * auVar80._12_4_;
          auVar42._16_4_ = auVar99._16_4_ * 0.0;
          auVar42._20_4_ = auVar99._20_4_ * 0.0;
          auVar42._24_4_ = auVar99._24_4_ * 0.0;
          auVar42._28_4_ = auVar103._28_4_;
          auVar84 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar76),auVar101);
          auVar43._4_4_ = auVar101._4_4_ * auVar75._4_4_;
          auVar43._0_4_ = auVar101._0_4_ * auVar75._0_4_;
          auVar43._8_4_ = auVar101._8_4_ * auVar75._8_4_;
          auVar43._12_4_ = auVar101._12_4_ * auVar75._12_4_;
          auVar43._16_4_ = auVar101._16_4_ * 0.0;
          auVar43._20_4_ = auVar101._20_4_ * 0.0;
          auVar43._24_4_ = auVar101._24_4_ * 0.0;
          auVar43._28_4_ = auVar101._28_4_;
          auVar83 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar80),auVar102);
          auVar44._4_4_ = auVar76._4_4_ * auVar102._4_4_;
          auVar44._0_4_ = auVar76._0_4_ * auVar102._0_4_;
          auVar44._8_4_ = auVar76._8_4_ * auVar102._8_4_;
          auVar44._12_4_ = auVar76._12_4_ * auVar102._12_4_;
          auVar44._16_4_ = auVar102._16_4_ * 0.0;
          auVar44._20_4_ = auVar102._20_4_ * 0.0;
          auVar44._24_4_ = auVar102._24_4_ * 0.0;
          auVar44._28_4_ = auVar102._28_4_;
          auVar74 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar75),auVar99);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar104,ZEXT1632(auVar83));
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,ZEXT1632(auVar84));
          auVar95 = ZEXT1632(auVar88);
          uVar55 = vcmpps_avx512vl(auVar99,auVar95,2);
          bVar54 = (byte)uVar55;
          fVar129 = (float)((uint)(bVar54 & 1) * auVar17._0_4_ |
                           (uint)!(bool)(bVar54 & 1) * auVar77._0_4_);
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          fVar131 = (float)((uint)bVar11 * auVar17._4_4_ | (uint)!bVar11 * auVar77._4_4_);
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          fVar133 = (float)((uint)bVar11 * auVar17._8_4_ | (uint)!bVar11 * auVar77._8_4_);
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          fVar135 = (float)((uint)bVar11 * auVar17._12_4_ | (uint)!bVar11 * auVar77._12_4_);
          auVar104 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar133,CONCAT44(fVar131,fVar129))));
          fVar130 = (float)((uint)(bVar54 & 1) * auVar78._0_4_ |
                           (uint)!(bool)(bVar54 & 1) * auVar79._0_4_);
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          fVar132 = (float)((uint)bVar11 * auVar78._4_4_ | (uint)!bVar11 * auVar79._4_4_);
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          fVar134 = (float)((uint)bVar11 * auVar78._8_4_ | (uint)!bVar11 * auVar79._8_4_);
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          fVar136 = (float)((uint)bVar11 * auVar78._12_4_ | (uint)!bVar11 * auVar79._12_4_);
          auVar100 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar134,CONCAT44(fVar132,fVar130))));
          auVar120._0_4_ =
               (float)((uint)(bVar54 & 1) * auVar105._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar81._0_4_);
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar11 * auVar105._4_4_ | (uint)!bVar11 * auVar81._4_4_);
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar11 * auVar105._8_4_ | (uint)!bVar11 * auVar81._8_4_);
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar11 * auVar105._12_4_ | (uint)!bVar11 * auVar81._12_4_)
          ;
          fVar196 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar105._16_4_);
          auVar120._16_4_ = fVar196;
          fVar194 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar105._20_4_);
          auVar120._20_4_ = fVar194;
          fVar156 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar105._24_4_);
          auVar120._24_4_ = fVar156;
          iVar1 = (uint)(byte)(uVar55 >> 7) * auVar105._28_4_;
          auVar120._28_4_ = iVar1;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar75),auVar90);
          auVar121._0_4_ =
               (uint)(bVar54 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar84._0_4_;
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * auVar84._4_4_;
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * auVar84._8_4_;
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * auVar84._12_4_;
          auVar121._16_4_ = (uint)((byte)(uVar55 >> 4) & 1) * auVar99._16_4_;
          auVar121._20_4_ = (uint)((byte)(uVar55 >> 5) & 1) * auVar99._20_4_;
          auVar121._24_4_ = (uint)((byte)(uVar55 >> 6) & 1) * auVar99._24_4_;
          auVar121._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar82));
          auVar122._0_4_ =
               (float)((uint)(bVar54 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar17._0_4_);
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * auVar17._4_4_);
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * auVar17._8_4_);
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar122._12_4_ = (float)((uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * auVar17._12_4_);
          fVar197 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar99._16_4_);
          auVar122._16_4_ = fVar197;
          fVar155 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar99._20_4_);
          auVar122._20_4_ = fVar155;
          fVar165 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar99._24_4_);
          auVar122._24_4_ = fVar165;
          auVar122._28_4_ = (uint)(byte)(uVar55 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar85));
          auVar123._0_4_ =
               (float)((uint)(bVar54 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar54 & 1) * auVar78._0_4_);
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * auVar78._4_4_);
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * auVar78._8_4_);
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * auVar78._12_4_);
          fVar67 = (float)((uint)((byte)(uVar55 >> 4) & 1) * auVar99._16_4_);
          auVar123._16_4_ = fVar67;
          fVar68 = (float)((uint)((byte)(uVar55 >> 5) & 1) * auVar99._20_4_);
          auVar123._20_4_ = fVar68;
          fVar164 = (float)((uint)((byte)(uVar55 >> 6) & 1) * auVar99._24_4_);
          auVar123._24_4_ = fVar164;
          iVar2 = (uint)(byte)(uVar55 >> 7) * auVar99._28_4_;
          auVar123._28_4_ = iVar2;
          auVar124._0_4_ =
               (uint)(bVar54 & 1) * (int)auVar75._0_4_ | (uint)!(bool)(bVar54 & 1) * auVar90._0_4_;
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar11 * (int)auVar75._4_4_ | (uint)!bVar11 * auVar90._4_4_;
          bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar11 * (int)auVar75._8_4_ | (uint)!bVar11 * auVar90._8_4_;
          bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar11 * (int)auVar75._12_4_ | (uint)!bVar11 * auVar90._12_4_;
          auVar124._16_4_ = (uint)!(bool)((byte)(uVar55 >> 4) & 1) * auVar90._16_4_;
          auVar124._20_4_ = (uint)!(bool)((byte)(uVar55 >> 5) & 1) * auVar90._20_4_;
          auVar124._24_4_ = (uint)!(bool)((byte)(uVar55 >> 6) & 1) * auVar90._24_4_;
          auVar124._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar90._28_4_;
          bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar55 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar55 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar55 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar55 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar55 >> 3) & 1);
          auVar90 = vsubps_avx512vl(auVar124,auVar104);
          auVar101 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar76._12_4_ |
                                                   (uint)!bVar15 * auVar82._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar76._8_4_ |
                                                            (uint)!bVar13 * auVar82._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar76._4_4_ |
                                                                     (uint)!bVar11 * auVar82._4_4_,
                                                                     (uint)(bVar54 & 1) *
                                                                     (int)auVar76._0_4_ |
                                                                     (uint)!(bool)(bVar54 & 1) *
                                                                     auVar82._0_4_)))),auVar100);
          auVar189 = ZEXT3264(auVar101);
          auVar105 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar80._12_4_ |
                                                   (uint)!bVar16 * auVar85._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar80._8_4_ |
                                                            (uint)!bVar14 * auVar85._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar80._4_4_ |
                                                                     (uint)!bVar12 * auVar85._4_4_,
                                                                     (uint)(bVar54 & 1) *
                                                                     (int)auVar80._0_4_ |
                                                                     (uint)!(bool)(bVar54 & 1) *
                                                                     auVar85._0_4_)))),auVar120);
          auVar103 = vsubps_avx(auVar104,auVar121);
          auVar192 = ZEXT3264(auVar103);
          auVar102 = vsubps_avx(auVar100,auVar122);
          auVar89 = vsubps_avx(auVar120,auVar123);
          auVar45._4_4_ = auVar105._4_4_ * fVar131;
          auVar45._0_4_ = auVar105._0_4_ * fVar129;
          auVar45._8_4_ = auVar105._8_4_ * fVar133;
          auVar45._12_4_ = auVar105._12_4_ * fVar135;
          auVar45._16_4_ = auVar105._16_4_ * 0.0;
          auVar45._20_4_ = auVar105._20_4_ * 0.0;
          auVar45._24_4_ = auVar105._24_4_ * 0.0;
          auVar45._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar45,auVar120,auVar90);
          auVar176._0_4_ = fVar130 * auVar90._0_4_;
          auVar176._4_4_ = fVar132 * auVar90._4_4_;
          auVar176._8_4_ = fVar134 * auVar90._8_4_;
          auVar176._12_4_ = fVar136 * auVar90._12_4_;
          auVar176._16_4_ = auVar90._16_4_ * 0.0;
          auVar176._20_4_ = auVar90._20_4_ * 0.0;
          auVar176._24_4_ = auVar90._24_4_ * 0.0;
          auVar176._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar176,auVar104,auVar101);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar95,ZEXT1632(auVar82));
          auVar182._0_4_ = auVar101._0_4_ * auVar120._0_4_;
          auVar182._4_4_ = auVar101._4_4_ * auVar120._4_4_;
          auVar182._8_4_ = auVar101._8_4_ * auVar120._8_4_;
          auVar182._12_4_ = auVar101._12_4_ * auVar120._12_4_;
          auVar182._16_4_ = auVar101._16_4_ * fVar196;
          auVar182._20_4_ = auVar101._20_4_ * fVar194;
          auVar182._24_4_ = auVar101._24_4_ * fVar156;
          auVar182._28_4_ = 0;
          auVar82 = vfmsub231ps_fma(auVar182,auVar100,auVar105);
          auVar91 = vfmadd231ps_avx512vl(auVar99,auVar95,ZEXT1632(auVar82));
          auVar99 = vmulps_avx512vl(auVar89,auVar121);
          auVar99 = vfmsub231ps_avx512vl(auVar99,auVar103,auVar123);
          auVar46._4_4_ = auVar102._4_4_ * auVar123._4_4_;
          auVar46._0_4_ = auVar102._0_4_ * auVar123._0_4_;
          auVar46._8_4_ = auVar102._8_4_ * auVar123._8_4_;
          auVar46._12_4_ = auVar102._12_4_ * auVar123._12_4_;
          auVar46._16_4_ = auVar102._16_4_ * fVar67;
          auVar46._20_4_ = auVar102._20_4_ * fVar68;
          auVar46._24_4_ = auVar102._24_4_ * fVar164;
          auVar46._28_4_ = iVar2;
          auVar82 = vfmsub231ps_fma(auVar46,auVar122,auVar89);
          auVar183._0_4_ = auVar122._0_4_ * auVar103._0_4_;
          auVar183._4_4_ = auVar122._4_4_ * auVar103._4_4_;
          auVar183._8_4_ = auVar122._8_4_ * auVar103._8_4_;
          auVar183._12_4_ = auVar122._12_4_ * auVar103._12_4_;
          auVar183._16_4_ = fVar197 * auVar103._16_4_;
          auVar183._20_4_ = fVar155 * auVar103._20_4_;
          auVar183._24_4_ = fVar165 * auVar103._24_4_;
          auVar183._28_4_ = 0;
          auVar85 = vfmsub231ps_fma(auVar183,auVar102,auVar121);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar85),auVar95,auVar99);
          auVar94 = vfmadd231ps_avx512vl(auVar99,auVar95,ZEXT1632(auVar82));
          auVar184 = ZEXT3264(auVar94);
          auVar99 = vmaxps_avx(auVar91,auVar94);
          uVar151 = vcmpps_avx512vl(auVar99,auVar95,2);
          bVar64 = bVar64 & (byte)uVar151;
          if (bVar64 != 0) {
            auVar47._4_4_ = auVar89._4_4_ * auVar101._4_4_;
            auVar47._0_4_ = auVar89._0_4_ * auVar101._0_4_;
            auVar47._8_4_ = auVar89._8_4_ * auVar101._8_4_;
            auVar47._12_4_ = auVar89._12_4_ * auVar101._12_4_;
            auVar47._16_4_ = auVar89._16_4_ * auVar101._16_4_;
            auVar47._20_4_ = auVar89._20_4_ * auVar101._20_4_;
            auVar47._24_4_ = auVar89._24_4_ * auVar101._24_4_;
            auVar47._28_4_ = auVar99._28_4_;
            auVar83 = vfmsub231ps_fma(auVar47,auVar102,auVar105);
            auVar48._4_4_ = auVar105._4_4_ * auVar103._4_4_;
            auVar48._0_4_ = auVar105._0_4_ * auVar103._0_4_;
            auVar48._8_4_ = auVar105._8_4_ * auVar103._8_4_;
            auVar48._12_4_ = auVar105._12_4_ * auVar103._12_4_;
            auVar48._16_4_ = auVar105._16_4_ * auVar103._16_4_;
            auVar48._20_4_ = auVar105._20_4_ * auVar103._20_4_;
            auVar48._24_4_ = auVar105._24_4_ * auVar103._24_4_;
            auVar48._28_4_ = auVar105._28_4_;
            auVar84 = vfmsub231ps_fma(auVar48,auVar90,auVar89);
            auVar49._4_4_ = auVar102._4_4_ * auVar90._4_4_;
            auVar49._0_4_ = auVar102._0_4_ * auVar90._0_4_;
            auVar49._8_4_ = auVar102._8_4_ * auVar90._8_4_;
            auVar49._12_4_ = auVar102._12_4_ * auVar90._12_4_;
            auVar49._16_4_ = auVar102._16_4_ * auVar90._16_4_;
            auVar49._20_4_ = auVar102._20_4_ * auVar90._20_4_;
            auVar49._24_4_ = auVar102._24_4_ * auVar90._24_4_;
            auVar49._28_4_ = auVar102._28_4_;
            auVar17 = vfmsub231ps_fma(auVar49,auVar103,auVar101);
            auVar82 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar17));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar82),ZEXT1632(auVar83),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar99 = vrcp14ps_avx512vl(ZEXT1632(auVar85));
            auVar26._8_4_ = 0x3f800000;
            auVar26._0_8_ = 0x3f8000003f800000;
            auVar26._12_4_ = 0x3f800000;
            auVar26._16_4_ = 0x3f800000;
            auVar26._20_4_ = 0x3f800000;
            auVar26._24_4_ = 0x3f800000;
            auVar26._28_4_ = 0x3f800000;
            auVar101 = vfnmadd213ps_avx512vl(auVar99,ZEXT1632(auVar85),auVar26);
            auVar82 = vfmadd132ps_fma(auVar101,auVar99,auVar99);
            auVar189 = ZEXT1664(auVar82);
            auVar50._4_4_ = auVar17._4_4_ * auVar120._4_4_;
            auVar50._0_4_ = auVar17._0_4_ * auVar120._0_4_;
            auVar50._8_4_ = auVar17._8_4_ * auVar120._8_4_;
            auVar50._12_4_ = auVar17._12_4_ * auVar120._12_4_;
            auVar50._16_4_ = fVar196 * 0.0;
            auVar50._20_4_ = fVar194 * 0.0;
            auVar50._24_4_ = fVar156 * 0.0;
            auVar50._28_4_ = iVar1;
            auVar84 = vfmadd231ps_fma(auVar50,auVar100,ZEXT1632(auVar84));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar104,ZEXT1632(auVar83));
            fVar156 = auVar82._0_4_;
            fVar194 = auVar82._4_4_;
            fVar196 = auVar82._8_4_;
            fVar197 = auVar82._12_4_;
            local_280._28_4_ = auVar99._28_4_;
            local_280._0_28_ =
                 ZEXT1628(CONCAT412(auVar84._12_4_ * fVar197,
                                    CONCAT48(auVar84._8_4_ * fVar196,
                                             CONCAT44(auVar84._4_4_ * fVar194,
                                                      auVar84._0_4_ * fVar156))));
            auVar192 = ZEXT3264(local_280);
            auVar53._4_4_ = uStack_47c;
            auVar53._0_4_ = local_480;
            auVar53._8_4_ = uStack_478;
            auVar53._12_4_ = uStack_474;
            auVar53._16_4_ = uStack_470;
            auVar53._20_4_ = uStack_46c;
            auVar53._24_4_ = uStack_468;
            auVar53._28_4_ = uStack_464;
            uVar151 = vcmpps_avx512vl(local_280,auVar53,0xd);
            uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar27._4_4_ = uVar150;
            auVar27._0_4_ = uVar150;
            auVar27._8_4_ = uVar150;
            auVar27._12_4_ = uVar150;
            auVar27._16_4_ = uVar150;
            auVar27._20_4_ = uVar150;
            auVar27._24_4_ = uVar150;
            auVar27._28_4_ = uVar150;
            uVar20 = vcmpps_avx512vl(local_280,auVar27,2);
            bVar64 = (byte)uVar151 & (byte)uVar20 & bVar64;
            if (bVar64 != 0) {
              uVar65 = vcmpps_avx512vl(ZEXT1632(auVar85),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar65 = bVar64 & uVar65;
              if ((char)uVar65 != '\0') {
                fVar165 = auVar91._0_4_ * fVar156;
                fVar155 = auVar91._4_4_ * fVar194;
                auVar51._4_4_ = fVar155;
                auVar51._0_4_ = fVar165;
                fVar164 = auVar91._8_4_ * fVar196;
                auVar51._8_4_ = fVar164;
                fVar67 = auVar91._12_4_ * fVar197;
                auVar51._12_4_ = fVar67;
                fVar68 = auVar91._16_4_ * 0.0;
                auVar51._16_4_ = fVar68;
                fVar129 = auVar91._20_4_ * 0.0;
                auVar51._20_4_ = fVar129;
                fVar130 = auVar91._24_4_ * 0.0;
                auVar51._24_4_ = fVar130;
                auVar51._28_4_ = auVar91._28_4_;
                auVar163._8_4_ = 0x3f800000;
                auVar163._0_8_ = 0x3f8000003f800000;
                auVar163._12_4_ = 0x3f800000;
                auVar163._16_4_ = 0x3f800000;
                auVar163._20_4_ = 0x3f800000;
                auVar163._24_4_ = 0x3f800000;
                auVar163._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx(auVar163,auVar51);
                local_2c0._0_4_ =
                     (float)((uint)(bVar54 & 1) * (int)fVar165 |
                            (uint)!(bool)(bVar54 & 1) * auVar99._0_4_);
                bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar11 * (int)fVar155 | (uint)!bVar11 * auVar99._4_4_);
                bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar11 * (int)fVar164 | (uint)!bVar11 * auVar99._8_4_);
                bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar11 * (int)fVar67 | (uint)!bVar11 * auVar99._12_4_);
                bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar11 * (int)fVar68 | (uint)!bVar11 * auVar99._16_4_);
                bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar11 * (int)fVar129 | (uint)!bVar11 * auVar99._20_4_);
                bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar11 * (int)fVar130 | (uint)!bVar11 * auVar99._24_4_);
                bVar11 = SUB81(uVar55 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar11 * auVar91._28_4_ | (uint)!bVar11 * auVar99._28_4_);
                auVar99 = vsubps_avx(auVar93,auVar92);
                auVar82 = vfmadd213ps_fma(auVar99,local_2c0,auVar92);
                uVar150 = *(undefined4 *)((long)local_548->ray_space + k * 4 + -0x10);
                auVar28._4_4_ = uVar150;
                auVar28._0_4_ = uVar150;
                auVar28._8_4_ = uVar150;
                auVar28._12_4_ = uVar150;
                auVar28._16_4_ = uVar150;
                auVar28._20_4_ = uVar150;
                auVar28._24_4_ = uVar150;
                auVar28._28_4_ = uVar150;
                auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar82._12_4_ + auVar82._12_4_,
                                                             CONCAT48(auVar82._8_4_ + auVar82._8_4_,
                                                                      CONCAT44(auVar82._4_4_ +
                                                                               auVar82._4_4_,
                                                                               auVar82._0_4_ +
                                                                               auVar82._0_4_)))),
                                          auVar28);
                uVar66 = vcmpps_avx512vl(local_280,auVar99,6);
                uVar65 = uVar65 & uVar66;
                bVar64 = (byte)uVar65;
                if (bVar64 != 0) {
                  auVar154._0_4_ = auVar94._0_4_ * fVar156;
                  auVar154._4_4_ = auVar94._4_4_ * fVar194;
                  auVar154._8_4_ = auVar94._8_4_ * fVar196;
                  auVar154._12_4_ = auVar94._12_4_ * fVar197;
                  auVar154._16_4_ = auVar94._16_4_ * 0.0;
                  auVar154._20_4_ = auVar94._20_4_ * 0.0;
                  auVar154._24_4_ = auVar94._24_4_ * 0.0;
                  auVar154._28_4_ = 0;
                  auVar177._8_4_ = 0x3f800000;
                  auVar177._0_8_ = 0x3f8000003f800000;
                  auVar177._12_4_ = 0x3f800000;
                  auVar177._16_4_ = 0x3f800000;
                  auVar177._20_4_ = 0x3f800000;
                  auVar177._24_4_ = 0x3f800000;
                  auVar177._28_4_ = 0x3f800000;
                  auVar99 = vsubps_avx(auVar177,auVar154);
                  auVar125._0_4_ =
                       (uint)(bVar54 & 1) * (int)auVar154._0_4_ |
                       (uint)!(bool)(bVar54 & 1) * auVar99._0_4_;
                  bVar11 = (bool)((byte)(uVar55 >> 1) & 1);
                  auVar125._4_4_ =
                       (uint)bVar11 * (int)auVar154._4_4_ | (uint)!bVar11 * auVar99._4_4_;
                  bVar11 = (bool)((byte)(uVar55 >> 2) & 1);
                  auVar125._8_4_ =
                       (uint)bVar11 * (int)auVar154._8_4_ | (uint)!bVar11 * auVar99._8_4_;
                  bVar11 = (bool)((byte)(uVar55 >> 3) & 1);
                  auVar125._12_4_ =
                       (uint)bVar11 * (int)auVar154._12_4_ | (uint)!bVar11 * auVar99._12_4_;
                  bVar11 = (bool)((byte)(uVar55 >> 4) & 1);
                  auVar125._16_4_ =
                       (uint)bVar11 * (int)auVar154._16_4_ | (uint)!bVar11 * auVar99._16_4_;
                  bVar11 = (bool)((byte)(uVar55 >> 5) & 1);
                  auVar125._20_4_ =
                       (uint)bVar11 * (int)auVar154._20_4_ | (uint)!bVar11 * auVar99._20_4_;
                  bVar11 = (bool)((byte)(uVar55 >> 6) & 1);
                  auVar125._24_4_ =
                       (uint)bVar11 * (int)auVar154._24_4_ | (uint)!bVar11 * auVar99._24_4_;
                  auVar125._28_4_ = (uint)!SUB81(uVar55 >> 7,0) * auVar99._28_4_;
                  auVar29._8_4_ = 0x40000000;
                  auVar29._0_8_ = 0x4000000040000000;
                  auVar29._12_4_ = 0x40000000;
                  auVar29._16_4_ = 0x40000000;
                  auVar29._20_4_ = 0x40000000;
                  auVar29._24_4_ = 0x40000000;
                  auVar29._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar125,auVar177,auVar29);
                  local_260 = (int)lVar59;
                  local_25c = iVar6;
                  local_250 = local_5b0._0_8_;
                  uStack_248 = local_5b0._8_8_;
                  local_240 = local_5d0._0_8_;
                  uStack_238 = local_5d0._8_8_;
                  local_230 = local_5e0._0_8_;
                  uStack_228 = local_5e0._8_8_;
                  local_220 = local_5c0;
                  uStack_218 = uStack_5b8;
                  pGVar60 = (context->scene->geometries).items[local_5e8].ptr;
                  if ((pGVar60->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    uVar63 = (uint)uVar65;
                    auVar82 = vcvtsi2ss_avx512f(auVar88,(int)lVar59);
                    fVar156 = auVar82._0_4_;
                    local_200[0] = (fVar156 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar156 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar156 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar156 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar156 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar156 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar156 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar156 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar145._8_4_ = 0x7f800000;
                    auVar145._0_8_ = 0x7f8000007f800000;
                    auVar145._12_4_ = 0x7f800000;
                    auVar145._16_4_ = 0x7f800000;
                    auVar145._20_4_ = 0x7f800000;
                    auVar145._24_4_ = 0x7f800000;
                    auVar145._28_4_ = 0x7f800000;
                    auVar99 = vblendmps_avx512vl(auVar145,local_280);
                    auVar126._0_4_ =
                         (uint)(bVar64 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000
                    ;
                    bVar11 = (bool)((byte)(uVar65 >> 1) & 1);
                    auVar126._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar65 >> 2) & 1);
                    auVar126._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar65 >> 3) & 1);
                    auVar126._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
                    auVar126._16_4_ = (uint)bVar11 * auVar99._16_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
                    auVar126._20_4_ = (uint)bVar11 * auVar99._20_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)((byte)(uVar65 >> 6) & 1);
                    auVar126._24_4_ = (uint)bVar11 * auVar99._24_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = SUB81(uVar65 >> 7,0);
                    auVar126._28_4_ = (uint)bVar11 * auVar99._28_4_ | (uint)!bVar11 * 0x7f800000;
                    auVar99 = vshufps_avx(auVar126,auVar126,0xb1);
                    auVar99 = vminps_avx(auVar126,auVar99);
                    auVar101 = vshufpd_avx(auVar99,auVar99,5);
                    auVar99 = vminps_avx(auVar99,auVar101);
                    auVar101 = vpermpd_avx2(auVar99,0x4e);
                    auVar99 = vminps_avx(auVar99,auVar101);
                    uVar151 = vcmpps_avx512vl(auVar126,auVar99,0);
                    if ((bVar64 & (byte)uVar151) != 0) {
                      uVar63 = (uint)(bVar64 & (byte)uVar151);
                    }
                    uVar57 = 0;
                    for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
                      uVar57 = uVar57 + 1;
                    }
                    uVar55 = (ulong)uVar57;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar60->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_570 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      local_558 = pGVar60;
                      local_538 = lVar61;
                      local_520 = local_280;
                      do {
                        local_420 = local_200[uVar55];
                        local_410 = *(undefined4 *)(local_1e0 + uVar55 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar55 * 4);
                        local_5a0.context = context->user;
                        fVar194 = 1.0 - local_420;
                        fVar156 = fVar194 * fVar194 * -3.0;
                        auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar194 * fVar194)),
                                                  ZEXT416((uint)(local_420 * fVar194)),
                                                  ZEXT416(0xc0000000));
                        auVar85 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar194)),
                                                  ZEXT416((uint)(local_420 * local_420)),
                                                  ZEXT416(0x40000000));
                        fVar194 = auVar82._0_4_ * 3.0;
                        fVar196 = auVar85._0_4_ * 3.0;
                        fVar197 = local_420 * local_420 * 3.0;
                        auVar187._0_4_ = fVar197 * (float)local_5c0._0_4_;
                        auVar187._4_4_ = fVar197 * (float)local_5c0._4_4_;
                        auVar187._8_4_ = fVar197 * (float)uStack_5b8;
                        auVar187._12_4_ = fVar197 * uStack_5b8._4_4_;
                        auVar189 = ZEXT1664(auVar187);
                        auVar138._4_4_ = fVar196;
                        auVar138._0_4_ = fVar196;
                        auVar138._8_4_ = fVar196;
                        auVar138._12_4_ = fVar196;
                        auVar82 = vfmadd132ps_fma(auVar138,auVar187,local_5e0);
                        auVar173._4_4_ = fVar194;
                        auVar173._0_4_ = fVar194;
                        auVar173._8_4_ = fVar194;
                        auVar173._12_4_ = fVar194;
                        auVar82 = vfmadd132ps_fma(auVar173,auVar82,local_5d0);
                        auVar139._4_4_ = fVar156;
                        auVar139._0_4_ = fVar156;
                        auVar139._8_4_ = fVar156;
                        auVar139._12_4_ = fVar156;
                        auVar82 = vfmadd132ps_fma(auVar139,auVar82,local_5b0);
                        local_450 = auVar82._0_4_;
                        local_440 = vshufps_avx(auVar82,auVar82,0x55);
                        auVar184 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar82,auVar82,0xaa);
                        iStack_44c = local_450;
                        iStack_448 = local_450;
                        iStack_444 = local_450;
                        fStack_41c = local_420;
                        fStack_418 = local_420;
                        fStack_414 = local_420;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        local_400 = local_4e0._0_8_;
                        uStack_3f8 = local_4e0._8_8_;
                        local_3f0 = local_4d0;
                        vpcmpeqd_avx2(ZEXT1632(local_4d0),ZEXT1632(local_4d0));
                        uStack_3dc = (local_5a0.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_5a0.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_600 = local_4f0;
                        local_5a0.valid = (int *)local_600;
                        local_5a0.geometryUserPtr = pGVar60->userPtr;
                        local_5a0.hit = (RTCHitN *)&local_450;
                        local_5a0.N = 4;
                        local_5a0.ray = (RTCRayN *)ray;
                        if (pGVar60->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar184 = ZEXT1664(local_440);
                          auVar189 = ZEXT1664(auVar187);
                          (*pGVar60->intersectionFilterN)(&local_5a0);
                          auVar192 = ZEXT3264(local_520);
                          pGVar60 = local_558;
                        }
                        uVar66 = vptestmd_avx512vl(local_600,local_600);
                        if ((uVar66 & 0xf) == 0) {
LAB_0191e471:
                          *(undefined4 *)(ray + k * 4 + 0x80) = local_570._0_4_;
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar60->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar184 = ZEXT1664(auVar184._0_16_);
                            auVar189 = ZEXT1664(auVar189._0_16_);
                            (*p_Var10)(&local_5a0);
                            auVar192 = ZEXT3264(local_520);
                            pGVar60 = local_558;
                          }
                          uVar66 = vptestmd_avx512vl(local_600,local_600);
                          uVar66 = uVar66 & 0xf;
                          bVar64 = (byte)uVar66;
                          if (bVar64 == 0) goto LAB_0191e471;
                          iVar1 = *(int *)(local_5a0.hit + 4);
                          iVar2 = *(int *)(local_5a0.hit + 8);
                          iVar52 = *(int *)(local_5a0.hit + 0xc);
                          bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                          bVar13 = SUB81(uVar66 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xc0) =
                               (uint)(bVar64 & 1) * *(int *)local_5a0.hit |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0xc0);
                          *(uint *)(local_5a0.ray + 0xc4) =
                               (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0xc4)
                          ;
                          *(uint *)(local_5a0.ray + 200) =
                               (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 200);
                          *(uint *)(local_5a0.ray + 0xcc) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_5a0.ray + 0xcc);
                          iVar1 = *(int *)(local_5a0.hit + 0x14);
                          iVar2 = *(int *)(local_5a0.hit + 0x18);
                          iVar52 = *(int *)(local_5a0.hit + 0x1c);
                          bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                          bVar13 = SUB81(uVar66 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xd0) =
                               (uint)(bVar64 & 1) * *(int *)(local_5a0.hit + 0x10) |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0xd0);
                          *(uint *)(local_5a0.ray + 0xd4) =
                               (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0xd4)
                          ;
                          *(uint *)(local_5a0.ray + 0xd8) =
                               (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xd8)
                          ;
                          *(uint *)(local_5a0.ray + 0xdc) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_5a0.ray + 0xdc);
                          iVar1 = *(int *)(local_5a0.hit + 0x24);
                          iVar2 = *(int *)(local_5a0.hit + 0x28);
                          iVar52 = *(int *)(local_5a0.hit + 0x2c);
                          bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                          bVar13 = SUB81(uVar66 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xe0) =
                               (uint)(bVar64 & 1) * *(int *)(local_5a0.hit + 0x20) |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0xe0);
                          *(uint *)(local_5a0.ray + 0xe4) =
                               (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0xe4)
                          ;
                          *(uint *)(local_5a0.ray + 0xe8) =
                               (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xe8)
                          ;
                          *(uint *)(local_5a0.ray + 0xec) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_5a0.ray + 0xec);
                          iVar1 = *(int *)(local_5a0.hit + 0x34);
                          iVar2 = *(int *)(local_5a0.hit + 0x38);
                          iVar52 = *(int *)(local_5a0.hit + 0x3c);
                          bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                          bVar13 = SUB81(uVar66 >> 3,0);
                          *(uint *)(local_5a0.ray + 0xf0) =
                               (uint)(bVar64 & 1) * *(int *)(local_5a0.hit + 0x30) |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0xf0);
                          *(uint *)(local_5a0.ray + 0xf4) =
                               (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_5a0.ray + 0xf4)
                          ;
                          *(uint *)(local_5a0.ray + 0xf8) =
                               (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_5a0.ray + 0xf8)
                          ;
                          *(uint *)(local_5a0.ray + 0xfc) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_5a0.ray + 0xfc);
                          iVar1 = *(int *)(local_5a0.hit + 0x44);
                          iVar2 = *(int *)(local_5a0.hit + 0x48);
                          iVar52 = *(int *)(local_5a0.hit + 0x4c);
                          bVar11 = (bool)((byte)(uVar66 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                          bVar13 = SUB81(uVar66 >> 3,0);
                          *(uint *)(local_5a0.ray + 0x100) =
                               (uint)(bVar64 & 1) * *(int *)(local_5a0.hit + 0x40) |
                               (uint)!(bool)(bVar64 & 1) * *(int *)(local_5a0.ray + 0x100);
                          *(uint *)(local_5a0.ray + 0x104) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_5a0.ray + 0x104);
                          *(uint *)(local_5a0.ray + 0x108) =
                               (uint)bVar12 * iVar2 |
                               (uint)!bVar12 * *(int *)(local_5a0.ray + 0x108);
                          *(uint *)(local_5a0.ray + 0x10c) =
                               (uint)bVar13 * iVar52 |
                               (uint)!bVar13 * *(int *)(local_5a0.ray + 0x10c);
                          auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x110) = auVar82;
                          auVar82 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x120) = auVar82;
                          auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x130) = auVar82;
                          auVar82 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_5a0.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_5a0.ray + 0x140) = auVar82;
                          local_570._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_570._4_4_ = 0;
                          local_570._8_4_ = 0;
                          local_570._12_4_ = 0;
                        }
                        bVar64 = ~(byte)(1 << ((uint)uVar55 & 0x1f)) & (byte)uVar65;
                        auVar146._4_4_ = local_570._0_4_;
                        auVar146._0_4_ = local_570._0_4_;
                        auVar146._8_4_ = local_570._0_4_;
                        auVar146._12_4_ = local_570._0_4_;
                        auVar146._16_4_ = local_570._0_4_;
                        auVar146._20_4_ = local_570._0_4_;
                        auVar146._24_4_ = local_570._0_4_;
                        auVar146._28_4_ = local_570._0_4_;
                        uVar151 = vcmpps_avx512vl(auVar192._0_32_,auVar146,2);
                        if ((bVar64 & (byte)uVar151) == 0) goto LAB_0191e516;
                        bVar64 = bVar64 & (byte)uVar151;
                        uVar63 = (uint)bVar64;
                        uVar65 = (ulong)uVar63;
                        auVar147._8_4_ = 0x7f800000;
                        auVar147._0_8_ = 0x7f8000007f800000;
                        auVar147._12_4_ = 0x7f800000;
                        auVar147._16_4_ = 0x7f800000;
                        auVar147._20_4_ = 0x7f800000;
                        auVar147._24_4_ = 0x7f800000;
                        auVar147._28_4_ = 0x7f800000;
                        auVar99 = vblendmps_avx512vl(auVar147,auVar192._0_32_);
                        auVar127._0_4_ =
                             (uint)(bVar64 & 1) * auVar99._0_4_ |
                             (uint)!(bool)(bVar64 & 1) * 0x7f800000;
                        bVar11 = (bool)(bVar64 >> 1 & 1);
                        auVar127._4_4_ = (uint)bVar11 * auVar99._4_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar64 >> 2 & 1);
                        auVar127._8_4_ = (uint)bVar11 * auVar99._8_4_ | (uint)!bVar11 * 0x7f800000;
                        bVar11 = (bool)(bVar64 >> 3 & 1);
                        auVar127._12_4_ = (uint)bVar11 * auVar99._12_4_ | (uint)!bVar11 * 0x7f800000
                        ;
                        bVar11 = (bool)(bVar64 >> 4 & 1);
                        auVar127._16_4_ = (uint)bVar11 * auVar99._16_4_ | (uint)!bVar11 * 0x7f800000
                        ;
                        bVar11 = (bool)(bVar64 >> 5 & 1);
                        auVar127._20_4_ = (uint)bVar11 * auVar99._20_4_ | (uint)!bVar11 * 0x7f800000
                        ;
                        bVar11 = (bool)(bVar64 >> 6 & 1);
                        auVar127._24_4_ = (uint)bVar11 * auVar99._24_4_ | (uint)!bVar11 * 0x7f800000
                        ;
                        auVar127._28_4_ =
                             (uint)(bVar64 >> 7) * auVar99._28_4_ |
                             (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
                        auVar99 = vshufps_avx(auVar127,auVar127,0xb1);
                        auVar99 = vminps_avx(auVar127,auVar99);
                        auVar101 = vshufpd_avx(auVar99,auVar99,5);
                        auVar99 = vminps_avx(auVar99,auVar101);
                        auVar101 = vpermpd_avx2(auVar99,0x4e);
                        auVar99 = vminps_avx(auVar99,auVar101);
                        uVar151 = vcmpps_avx512vl(auVar127,auVar99,0);
                        bVar64 = (byte)uVar151 & bVar64;
                        if (bVar64 != 0) {
                          uVar63 = (uint)bVar64;
                        }
                        uVar57 = 0;
                        for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
                          uVar57 = uVar57 + 1;
                        }
                        uVar55 = (ulong)uVar57;
                      } while( true );
                    }
                    fVar156 = local_200[uVar55];
                    uVar150 = *(undefined4 *)(local_1e0 + uVar55 * 4);
                    fVar196 = 1.0 - fVar156;
                    fVar194 = fVar196 * fVar196 * -3.0;
                    auVar184 = ZEXT464((uint)fVar194);
                    auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                              ZEXT416((uint)(fVar156 * fVar196)),ZEXT416(0xc0000000)
                                             );
                    auVar85 = vfmsub132ss_fma(ZEXT416((uint)(fVar156 * fVar196)),
                                              ZEXT416((uint)(fVar156 * fVar156)),ZEXT416(0x40000000)
                                             );
                    fVar196 = auVar82._0_4_ * 3.0;
                    fVar197 = auVar85._0_4_ * 3.0;
                    fVar165 = fVar156 * fVar156 * 3.0;
                    auVar186._0_4_ = fVar165 * (float)local_5c0._0_4_;
                    auVar186._4_4_ = fVar165 * (float)local_5c0._4_4_;
                    auVar186._8_4_ = fVar165 * (float)uStack_5b8;
                    auVar186._12_4_ = fVar165 * uStack_5b8._4_4_;
                    auVar189 = ZEXT1664(auVar186);
                    auVar160._4_4_ = fVar197;
                    auVar160._0_4_ = fVar197;
                    auVar160._8_4_ = fVar197;
                    auVar160._12_4_ = fVar197;
                    auVar82 = vfmadd132ps_fma(auVar160,auVar186,local_5e0);
                    auVar172._4_4_ = fVar196;
                    auVar172._0_4_ = fVar196;
                    auVar172._8_4_ = fVar196;
                    auVar172._12_4_ = fVar196;
                    auVar82 = vfmadd132ps_fma(auVar172,auVar82,local_5d0);
                    auVar161._4_4_ = fVar194;
                    auVar161._0_4_ = fVar194;
                    auVar161._8_4_ = fVar194;
                    auVar161._12_4_ = fVar194;
                    auVar82 = vfmadd132ps_fma(auVar161,auVar82,local_5b0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar55 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar82._0_4_;
                    uVar7 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar7;
                    uVar7 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar7;
                    *(float *)(ray + k * 4 + 0xf0) = fVar156;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar150;
                    *(int *)(ray + k * 4 + 0x110) = (int)local_540;
                    *(int *)(ray + k * 4 + 0x120) = (int)local_5e8;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_0191e182;
      }
    }
    uVar150 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar22._4_4_ = uVar150;
    auVar22._0_4_ = uVar150;
    auVar22._8_4_ = uVar150;
    auVar22._12_4_ = uVar150;
    uVar151 = vcmpps_avx512vl(local_190,auVar22,2);
    local_528 = (ulong)((uint)local_528 & (uint)local_528 + 0xf & (uint)uVar151);
  } while( true );
LAB_0191e516:
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar212 = ZEXT1664(auVar82);
  auVar213 = ZEXT464(0xbf800000);
  auVar82 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar214 = ZEXT1664(auVar82);
  lVar61 = local_538;
  prim = local_5f0;
LAB_0191e182:
  lVar59 = lVar59 + 8;
  goto LAB_0191d8c9;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }